

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxHarrisRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,int param_2,bool param_3)

{
  undefined8 *puVar1;
  uint *puVar2;
  double dVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar5;
  long lVar6;
  long *plVar7;
  long lVar8;
  long *plVar9;
  long *plVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  uint uVar19;
  uint uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  bool bVar25;
  int iVar26;
  fpclass_type fVar27;
  int iVar28;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  double *pdVar29;
  undefined4 extraout_var_10;
  cpp_dec_float<50U,_int,_void> *pcVar30;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  cpp_dec_float<50U,_int,_void> *pcVar31;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined8 uVar32;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  long lVar35;
  uint uVar36;
  cpp_dec_float<50U,_int,_void> *pcVar37;
  long lVar38;
  undefined1 *puVar39;
  ulong uVar40;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_7a0;
  uint local_79c;
  cpp_dec_float<50U,_int,_void> local_798;
  cpp_dec_float<50U,_int,_void> local_758;
  cpp_dec_float<50U,_int,_void> local_718;
  SPxId enterId;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_678;
  long *local_640;
  long *local_638;
  cpp_dec_float<50U,_int,_void> *local_630;
  cpp_dec_float<50U,_int,_void> local_628;
  cpp_dec_float<50U,_int,_void> local_5e8;
  cpp_dec_float<50U,_int,_void> local_5a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  degeneps;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  cpp_dec_float<50U,_int,_void> local_4a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  cmaxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minStability;
  cpp_dec_float<50U,_int,_void> local_3a8;
  cpp_dec_float<50U,_int,_void> local_368;
  cpp_dec_float<50U,_int,_void> local_328;
  cpp_dec_float<50U,_int,_void> local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  cpp_dec_float<50u,int,void> local_a8 [16];
  undefined1 local_98 [13];
  undefined3 uStack_8b;
  undefined1 auStack_88 [13];
  undefined8 local_78;
  cpp_dec_float<50u,int,void> local_68 [16];
  undefined1 local_58 [13];
  undefined3 uStack_4b;
  undefined1 auStack_48 [13];
  undefined8 local_38;
  undefined8 uVar33;
  undefined8 uVar34;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_678.fpclass = cpp_dec_float_finite;
  local_678.prec_elem = 10;
  local_678.data._M_elems[0] = 0;
  local_678.data._M_elems[1] = 0;
  local_678.data._M_elems[2] = 0;
  local_678.data._M_elems[3] = 0;
  local_678.data._M_elems[4] = 0;
  local_678.data._M_elems[5] = 0;
  local_678.data._M_elems[6] = 0;
  local_678.data._M_elems[7] = 0;
  local_678.data._M_elems[8] = 0;
  local_678.data._M_elems[9] = 0;
  local_678.exp = 0;
  local_678.neg = false;
  local_798.fpclass = cpp_dec_float_finite;
  local_798.prec_elem = 10;
  local_798.data._M_elems[0] = 0;
  local_798.data._M_elems[1] = 0;
  local_798.data._M_elems[2] = 0;
  local_798.data._M_elems[3] = 0;
  local_798.data._M_elems[4] = 0;
  local_798.data._M_elems[5] = 0;
  local_798.data._M_elems[6] = 0;
  local_798.data._M_elems[7] = 0;
  local_798.data._M_elems[8] = 0;
  local_798.data._M_elems[9] = 0;
  local_798.exp = 0;
  local_798.neg = false;
  local_758.fpclass = cpp_dec_float_finite;
  local_758.prec_elem = 10;
  local_758.data._M_elems[0] = 0;
  local_758.data._M_elems[1] = 0;
  local_758.data._M_elems[2] = 0;
  local_758.data._M_elems[3] = 0;
  local_758.data._M_elems[4] = 0;
  local_758.data._M_elems[5] = 0;
  local_758.data._M_elems._24_5_ = 0;
  local_758.data._M_elems[7]._1_3_ = 0;
  local_758.data._M_elems._32_5_ = 0;
  local_758.data._M_elems[9]._1_3_ = 0;
  local_758.exp = 0;
  local_758.neg = false;
  local_5a8.fpclass = cpp_dec_float_finite;
  local_5a8.prec_elem = 10;
  local_5a8.data._M_elems[0] = 0;
  local_5a8.data._M_elems[1] = 0;
  local_5a8.data._M_elems[2] = 0;
  local_5a8.data._M_elems[3] = 0;
  local_5a8.data._M_elems[4] = 0;
  local_5a8.data._M_elems[5] = 0;
  local_5a8.data._M_elems[6] = 0;
  local_5a8.data._M_elems[7] = 0;
  local_5a8.data._M_elems._32_5_ = 0;
  local_5a8.data._M_elems[9]._1_3_ = 0;
  local_5a8.exp = 0;
  local_5a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_5a8,0.0);
  local_718.fpclass = cpp_dec_float_finite;
  local_718.prec_elem = 10;
  local_718.data._M_elems[0] = 0;
  local_718.data._M_elems[1] = 0;
  local_718.data._M_elems[2] = 0;
  local_718.data._M_elems[3] = 0;
  local_718.data._M_elems[4] = 0;
  local_718.data._M_elems[5] = 0;
  local_718.data._M_elems._24_5_ = 0;
  local_718.data._M_elems[7]._1_3_ = 0;
  local_718.data._M_elems._32_5_ = 0;
  local_718.data._M_elems[9]._1_3_ = 0;
  local_718.exp = 0;
  local_718.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_718,0.0);
  local_4a8.fpclass = cpp_dec_float_finite;
  local_4a8.prec_elem = 10;
  local_4a8.data._M_elems[0] = 0;
  local_4a8.data._M_elems[1] = 0;
  local_4a8.data._M_elems[2] = 0;
  local_4a8.data._M_elems[3] = 0;
  local_4a8.data._M_elems[4] = 0;
  local_4a8.data._M_elems[5] = 0;
  local_4a8.data._M_elems._24_5_ = 0;
  local_4a8.data._M_elems[7]._1_3_ = 0;
  local_4a8.data._M_elems._32_5_ = 0;
  local_4a8.data._M_elems[9]._1_3_ = 0;
  local_4a8.exp = 0;
  local_4a8.neg = false;
  local_5e8.fpclass = cpp_dec_float_finite;
  local_5e8.prec_elem = 10;
  local_5e8.data._M_elems[0] = 0;
  local_5e8.data._M_elems[1] = 0;
  local_5e8.data._M_elems[2] = 0;
  local_5e8.data._M_elems[3] = 0;
  local_5e8.data._M_elems[4] = 0;
  local_5e8.data._M_elems[5] = 0;
  local_5e8.data._M_elems._24_5_ = 0;
  local_5e8.data._M_elems[7]._1_3_ = 0;
  local_5e8.data._M_elems._32_5_ = 0;
  local_5e8.data._M_elems[9]._1_3_ = 0;
  local_5e8.exp = 0;
  local_5e8.neg = false;
  local_628.fpclass = cpp_dec_float_finite;
  local_628.prec_elem = 10;
  local_628.data._M_elems[0] = 0;
  local_628.data._M_elems[1] = 0;
  local_628.data._M_elems[2] = 0;
  local_628.data._M_elems[3] = 0;
  local_628.data._M_elems[4] = 0;
  local_628.data._M_elems[5] = 0;
  local_628.data._M_elems._24_5_ = 0;
  local_628.data._M_elems[7]._1_3_ = 0;
  local_628.data._M_elems._32_5_ = 0;
  local_628.data._M_elems[9]._1_3_ = 0;
  local_628.exp = 0;
  local_628.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&cmaxabs.m_backend,1,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
            (&rmaxabs.m_backend,1,(type *)0x0);
  peVar4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar3 = peVar4->s_epsilon_multiplier;
  uVar40 = -(ulong)(dVar3 == 1.0);
  minStability.m_backend.fpclass = cpp_dec_float_finite;
  minStability.m_backend.prec_elem = 10;
  minStability.m_backend.data._M_elems[0] = 0;
  minStability.m_backend.data._M_elems[1] = 0;
  minStability.m_backend.data._M_elems[2] = 0;
  minStability.m_backend.data._M_elems[3] = 0;
  minStability.m_backend.data._M_elems[4] = 0;
  minStability.m_backend.data._M_elems[5] = 0;
  minStability.m_backend.data._M_elems._24_5_ = 0;
  minStability.m_backend.data._M_elems[7]._1_3_ = 0;
  minStability.m_backend.data._M_elems._32_5_ = 0;
  minStability.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&minStability,
             (double)(~uVar40 & (ulong)(dVar3 * 0.0001) | uVar40 & 0x3f1a36e2eb1c432d));
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar26) + 0x1e0));
  epsilon.m_backend.fpclass = cpp_dec_float_finite;
  epsilon.m_backend.prec_elem = 10;
  epsilon.m_backend.data._M_elems[0] = 0;
  epsilon.m_backend.data._M_elems[1] = 0;
  epsilon.m_backend.data._M_elems[2] = 0;
  epsilon.m_backend.data._M_elems[3] = 0;
  epsilon.m_backend.data._M_elems[4] = 0;
  epsilon.m_backend.data._M_elems[5] = 0;
  epsilon.m_backend.data._M_elems._24_5_ = 0;
  epsilon.m_backend.data._M_elems[7]._1_3_ = 0;
  epsilon.m_backend.data._M_elems._32_5_ = 0;
  epsilon.m_backend.data._M_elems[9]._1_3_ = 0;
  epsilon.m_backend.exp = 0;
  epsilon.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&epsilon,a);
  degenerateEps(&degeneps,this);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar5 = *(long **)(CONCAT44(extraout_var_00,iVar26) + 0xa60);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar6 = *(long *)(CONCAT44(extraout_var_01,iVar26) + 0xa60);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar7 = *(long **)(CONCAT44(extraout_var_02,iVar26) + 0xa58);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  lVar8 = *(long *)(CONCAT44(extraout_var_03,iVar26) + 0xa58);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_638 = *(long **)(CONCAT44(extraout_var_04,iVar26) + 0xa78);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  local_640 = *(long **)(CONCAT44(extraout_var_05,iVar26) + 0xa80);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar9 = *(long **)(CONCAT44(extraout_var_06,iVar26) + 0xa88);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  plVar10 = *(long **)(CONCAT44(extraout_var_07,iVar26) + 0xa90);
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_08,iVar26) + 0xa58) + 0x50));
  iVar26 = (*(this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_09,iVar26) + 0xa60) + 0x50));
  if (epsilon.m_backend.fpclass != cpp_dec_float_NaN &&
      (val->m_backend).fpclass != cpp_dec_float_NaN) {
    iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&val->m_backend,&epsilon.m_backend);
    if (0 < iVar26) {
      pdVar29 = (double *)__tls_get_addr(&PTR_003b4b70);
      dVar3 = *pdVar29;
      local_630 = &(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).delta.m_backend;
LAB_002ce4eb:
      do {
        do {
          uVar34 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
          local_5a8.data._M_elems._32_5_ = SUB85(uVar34,0);
          local_5a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          local_5a8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
          local_5a8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
          local_5a8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
          local_5a8.data._M_elems[6] = (val->m_backend).data._M_elems[6];
          local_5a8.data._M_elems[7] = (val->m_backend).data._M_elems[7];
          local_5a8.exp = (val->m_backend).exp;
          local_5a8.neg = (val->m_backend).neg;
          local_5a8.fpclass = (val->m_backend).fpclass;
          local_5a8.prec_elem = (val->m_backend).prec_elem;
          iVar26 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar26) + 0x368))
                    (&result_1,(long *)CONCAT44(extraout_var_10,iVar26));
          auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
          local_4a8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_4a8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_4a8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_4a8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_4a8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_4a8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_4a8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_4a8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_4a8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_4a8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_4a8.exp = result_1.m_backend.exp;
          local_4a8.neg = result_1.m_backend.neg;
          local_4a8.fpclass = result_1.m_backend.fpclass;
          local_4a8.prec_elem = result_1.m_backend.prec_elem;
          result_1.m_backend.data._M_elems._0_16_ = auVar17;
          maxDelta(this,&rmaxabs,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_5a8,*(int *)(lVar6 + 0x58),*(int **)(lVar6 + 0x60),
                   *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(lVar6 + 0x70),
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar5,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_640,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*local_638);
          maxDelta(this,&cmaxabs,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_5a8,*(int *)(lVar8 + 0x58),*(int **)(lVar8 + 0x60),
                   *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     **)(lVar8 + 0x70),
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar7,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar10,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)*plVar9);
          if (((local_5a8.fpclass != cpp_dec_float_NaN) &&
              ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_5a8,&val->m_backend), iVar26 == 0)) {
            uVar34._0_4_ = enterId.super_DataKey.info;
            uVar34._4_4_ = enterId.super_DataKey.idx;
            return (SPxId)uVar34;
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_678,0);
          ::soplex::infinity::__tls_init();
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&result_1,-dVar3);
          local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_718.exp = result_1.m_backend.exp;
          local_718.neg = result_1.m_backend.neg;
          local_718.fpclass = result_1.m_backend.fpclass;
          local_718.prec_elem = result_1.m_backend.prec_elem;
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&result_1,0.001);
          result.m_backend.data._M_elems[0] = rmaxabs.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = rmaxabs.m_backend.data._M_elems[1];
          result.m_backend.data._M_elems[2] = rmaxabs.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = rmaxabs.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[4] = rmaxabs.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = rmaxabs.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems._24_5_ = rmaxabs.m_backend.data._M_elems._24_5_;
          result.m_backend.data._M_elems[7]._1_3_ = rmaxabs.m_backend.data._M_elems[7]._1_3_;
          result.m_backend.data._M_elems._32_5_ = rmaxabs.m_backend.data._M_elems._32_5_;
          result.m_backend.data._M_elems[9]._1_3_ = rmaxabs.m_backend.data._M_elems[9]._1_3_;
          result.m_backend.exp = rmaxabs.m_backend.exp;
          result.m_backend.neg = rmaxabs.m_backend.neg;
          result.m_backend.fpclass = rmaxabs.m_backend.fpclass;
          result.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result.m_backend,&result_1.m_backend);
          result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
          result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
          result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
          result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
          result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
          result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
          result_1.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
          result_1.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
          result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
          result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
          result_1.m_backend.exp = result.m_backend.exp;
          result_1.m_backend.neg = result.m_backend.neg;
          result_1.m_backend.fpclass = result.m_backend.fpclass;
          result_1.m_backend.prec_elem = result.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_1.m_backend,&epsilon.m_backend);
          local_628.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_628.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_628.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_628.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_628.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_628.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_628.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_628.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_628.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_628.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_628.exp = result_1.m_backend.exp;
          local_628.neg = result_1.m_backend.neg;
          local_628.fpclass = result_1.m_backend.fpclass;
          local_628.prec_elem = result_1.m_backend.prec_elem;
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_628,&epsilon.m_backend), iVar26 < 0)) {
            local_628.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
            local_628.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
            local_628.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
            local_628.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
            local_628.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
            local_628.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
            local_628.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
            local_628.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
            local_628.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
            local_628.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
            local_628.exp = epsilon.m_backend.exp;
            local_628.neg = epsilon.m_backend.neg;
            local_628.fpclass = epsilon.m_backend.fpclass;
            local_628.prec_elem = epsilon.m_backend.prec_elem;
          }
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 10;
          result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems._24_5_ = 0;
          result.m_backend.data._M_elems[7]._1_3_ = 0;
          result.m_backend.data._M_elems._32_5_ = 0;
          result.m_backend.data._M_elems[9]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&result_1,0.001);
          result.m_backend.data._M_elems[2] = cmaxabs.m_backend.data._M_elems[2];
          result.m_backend.data._M_elems[3] = cmaxabs.m_backend.data._M_elems[3];
          result.m_backend.data._M_elems[0] = cmaxabs.m_backend.data._M_elems[0];
          result.m_backend.data._M_elems[1] = cmaxabs.m_backend.data._M_elems[1];
          result.m_backend.data._M_elems[4] = cmaxabs.m_backend.data._M_elems[4];
          result.m_backend.data._M_elems[5] = cmaxabs.m_backend.data._M_elems[5];
          result.m_backend.data._M_elems._24_5_ = cmaxabs.m_backend.data._M_elems._24_5_;
          result.m_backend.data._M_elems[7]._1_3_ = cmaxabs.m_backend.data._M_elems[7]._1_3_;
          result.m_backend.data._M_elems._32_5_ = cmaxabs.m_backend.data._M_elems._32_5_;
          result.m_backend.data._M_elems[9]._1_3_ = cmaxabs.m_backend.data._M_elems[9]._1_3_;
          result.m_backend.exp = cmaxabs.m_backend.exp;
          result.m_backend.neg = cmaxabs.m_backend.neg;
          result.m_backend.fpclass = cmaxabs.m_backend.fpclass;
          result.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result.m_backend,&result_1.m_backend);
          result_1.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
          result_1.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
          result_1.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
          result_1.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
          result_1.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
          result_1.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
          result_1.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
          result_1.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
          result_1.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
          result_1.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
          result_1.m_backend.exp = result.m_backend.exp;
          result_1.m_backend.neg = result.m_backend.neg;
          result_1.m_backend.fpclass = result.m_backend.fpclass;
          result_1.m_backend.prec_elem = result.m_backend.prec_elem;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                    (&result_1.m_backend,&epsilon.m_backend);
          auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
          local_5e8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_5e8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_5e8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_5e8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_5e8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_5e8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_5e8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_5e8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_5e8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_5e8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_5e8.exp = result_1.m_backend.exp;
          local_5e8.neg = result_1.m_backend.neg;
          local_5e8.fpclass = result_1.m_backend.fpclass;
          local_5e8.prec_elem = result_1.m_backend.prec_elem;
          result_1.m_backend.data._M_elems._0_16_ = auVar17;
          if (((result_1.m_backend.fpclass != cpp_dec_float_NaN) &&
              (epsilon.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&local_5e8,&epsilon.m_backend), iVar26 < 0)) {
            local_5e8.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
            local_5e8.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
            local_5e8.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
            local_5e8.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
            local_5e8.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
            local_5e8.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
            local_5e8.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
            local_5e8.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
            local_5e8.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
            local_5e8.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
            local_5e8.exp = epsilon.m_backend.exp;
            local_5e8.neg = epsilon.m_backend.neg;
            local_5e8.fpclass = epsilon.m_backend.fpclass;
            local_5e8.prec_elem = epsilon.m_backend.prec_elem;
          }
          local_79c = 0xffffffff;
          local_7a0 = 0xffffffff;
          if (0 < (long)*(int *)(lVar6 + 0x58)) {
            uVar40 = (long)*(int *)(lVar6 + 0x58) + 1;
            local_7a0 = 0xffffffff;
            do {
              lVar35 = *(long *)(lVar6 + 0x70);
              uVar36 = *(uint *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4);
              lVar38 = (long)(int)uVar36 * 0x38;
              local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              uVar11 = *(undefined8 *)(lVar35 + lVar38);
              uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
              puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_798.data._M_elems[8] = (uint)uVar34;
              local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
              local_798.data._M_elems[4] = (uint)uVar13;
              local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
              local_798.data._M_elems[6] = (uint)uVar14;
              local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
              local_798.data._M_elems[0] = (uint)uVar11;
              local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
              local_798.data._M_elems[2] = (uint)uVar12;
              local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
              if (local_628.fpclass == cpp_dec_float_NaN || local_798.fpclass == cpp_dec_float_NaN)
              {
LAB_002cebe3:
                result_1.m_backend.data._M_elems[2] = local_628.data._M_elems[2];
                result_1.m_backend.data._M_elems[3] = local_628.data._M_elems[3];
                result_1.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
                result_1.m_backend.data._M_elems[1] = local_628.data._M_elems[1];
                auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                result_1.m_backend.data._M_elems._32_5_ = local_628.data._M_elems._32_5_;
                result_1.m_backend.data._M_elems[9]._1_3_ = local_628.data._M_elems[9]._1_3_;
                result_1.m_backend.data._M_elems[4] = local_628.data._M_elems[4];
                result_1.m_backend.data._M_elems[5] = local_628.data._M_elems[5];
                result_1.m_backend.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
                result_1.m_backend.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
                result_1.m_backend.exp = local_628.exp;
                result_1.m_backend.neg = local_628.neg;
                result_1.m_backend.prec_elem = local_628.prec_elem;
                result_1.m_backend.fpclass = local_628.fpclass;
                result_1.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    local_628.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(local_628.neg ^ 1);
                }
                result_1.m_backend.data._M_elems._0_16_ = auVar17;
                if (((local_628.fpclass == cpp_dec_float_NaN) ||
                    (local_798.fpclass == cpp_dec_float_NaN)) ||
                   (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&result_1.m_backend), -1 < iVar26)) {
                  lVar35 = *(long *)(lVar6 + 0x70);
                  lVar38 = (long)*(int *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4) * 0x38;
                  *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
                  *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
                  iVar26 = *(int *)(lVar6 + 0x58);
                  *(int *)(lVar6 + 0x58) = iVar26 + -1;
                  *(undefined4 *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4) =
                       *(undefined4 *)(*(long *)(lVar6 + 0x60) + -4 + (long)iVar26 * 4);
                  uVar11 = result_1.m_backend._48_8_;
                }
                else {
                  pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_640 + lVar38);
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 10;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems._24_5_ = 0;
                  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                  result_1.m_backend.data._M_elems._32_5_ = 0;
                  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&result_1.m_backend,pcVar30);
                    if (result_1.m_backend.data._M_elems[0] != 0 ||
                        result_1.m_backend.fpclass != cpp_dec_float_finite) {
                      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                    }
                  }
                  else {
                    if (&result_1.m_backend != pcVar30) {
                      uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                      result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                      result_1.m_backend.data._M_elems[9]._1_3_ =
                           (undefined3)((ulong)uVar34 >> 0x28);
                      result_1.m_backend.data._M_elems._0_16_ =
                           *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                      result_1.m_backend.data._M_elems._16_8_ =
                           *(undefined8 *)((pcVar30->data)._M_elems + 4);
                      uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                      result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                      result_1.m_backend.data._M_elems[7]._1_3_ =
                           (undefined3)((ulong)uVar34 >> 0x28);
                      result_1.m_backend.exp = pcVar30->exp;
                      result_1.m_backend.neg = pcVar30->neg;
                      result_1.m_backend.fpclass = pcVar30->fpclass;
                      result_1.m_backend.prec_elem = pcVar30->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&result_1.m_backend,
                               (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
                  }
                  auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                  local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                  local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                  local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                  local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                  local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
                  local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
                  local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                  local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                  local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                  local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                  local_758.exp = result_1.m_backend.exp;
                  local_758.neg = result_1.m_backend.neg;
                  local_758.fpclass = result_1.m_backend.fpclass;
                  local_758.prec_elem = result_1.m_backend.prec_elem;
                  result_1.m_backend.data._M_elems._0_16_ = auVar17;
                  if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                     (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_758,&degeneps.m_backend), iVar26 < 1)) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                              (&local_758,&local_798);
                    uVar11 = result_1.m_backend._48_8_;
                    if (((local_758.fpclass != cpp_dec_float_NaN) &&
                        (local_5a8.fpclass != cpp_dec_float_NaN)) &&
                       (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_758,&local_5a8), uVar11 = result_1.m_backend._48_8_,
                       iVar26 < 1)) {
                      result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                      result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                      result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                      result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                      result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                      result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                      result_1.m_backend.data._M_elems._32_5_ =
                           SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                      result_1.m_backend.data._M_elems[9]._1_3_ =
                           (undefined3)(local_798.data._M_elems[9] >> 8);
                      result_1.m_backend.data._M_elems._24_5_ =
                           SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
                      result_1.m_backend.data._M_elems[7]._1_3_ =
                           (undefined3)(local_798.data._M_elems[7] >> 8);
                      result_1.m_backend.exp = local_798.exp;
                      result_1.m_backend.neg = local_798.neg;
                      uVar11._0_4_ = local_798.fpclass;
                      uVar11._4_4_ = local_798.prec_elem;
                      result_1.m_backend.fpclass = local_798.fpclass;
                      result_1.m_backend.prec_elem = local_798.prec_elem;
                      if (local_798.data._M_elems[0] != 0 ||
                          local_798.fpclass != cpp_dec_float_finite) {
                        result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
                      }
                      if (((local_798.fpclass != cpp_dec_float_NaN) &&
                          (uVar11 = result_1.m_backend._48_8_,
                          local_678.fpclass != cpp_dec_float_NaN)) &&
                         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&result_1.m_backend,&local_678),
                         uVar11 = result_1.m_backend._48_8_, -1 < iVar26)) {
                        iVar26 = (*(this->
                                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        *)CONCAT44(extraout_var_14,iVar26),uVar36);
                        local_678.neg =
                             (bool)((local_798.data._M_elems[0] != 0 ||
                                    local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                        uVar11 = result_1.m_backend._48_8_;
                        local_7a0 = uVar36;
                        local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                        local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                        local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                        local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                        local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                        local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                        local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                        local_718.exp = local_758.exp;
                        local_718.neg = local_758.neg;
                        local_718._48_8_ = local_758._48_8_;
                        local_678.data._M_elems[0] = local_798.data._M_elems[0];
                        local_678.data._M_elems[1] = local_798.data._M_elems[1];
                        local_678.data._M_elems[2] = local_798.data._M_elems[2];
                        local_678.data._M_elems[3] = local_798.data._M_elems[3];
                        local_678.data._M_elems[4] = local_798.data._M_elems[4];
                        local_678.data._M_elems[5] = local_798.data._M_elems[5];
                        local_678.data._M_elems[6] = local_798.data._M_elems[6];
                        local_678.data._M_elems[7] = local_798.data._M_elems[7];
                        local_678.data._M_elems[8] = local_798.data._M_elems[8];
                        local_678.data._M_elems[9] = local_798.data._M_elems[9];
                        local_678.exp = local_798.exp;
                        local_678._48_8_ = local_798._48_8_;
                      }
                    }
                  }
                  else {
                    iVar26 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    puVar39 = (undefined1 *)(lVar38 + *plVar5);
                    local_328.fpclass = cpp_dec_float_finite;
                    local_328.prec_elem = 10;
                    local_328.data._M_elems[8] = 0;
                    local_328.data._M_elems[9] = 0;
                    local_328.exp = 0;
                    local_328.neg = false;
                    local_328.data._M_elems[4] = 0;
                    local_328.data._M_elems[5] = 0;
                    local_328.data._M_elems._24_5_ = 0;
                    local_328.data._M_elems[7]._1_3_ = 0;
                    local_328.data._M_elems[0] = 0;
                    local_328.data._M_elems[1] = 0;
                    local_328.data._M_elems[2] = 0;
                    local_328.data._M_elems[3] = 0;
                    if (&local_328 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                      local_328.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                      local_328.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                      local_328.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                      local_328.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                      local_328.data._M_elems[7]._1_3_ =
                           (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                      local_328.exp = *(int *)((long)puVar39 + 0x28);
                      local_328.neg = *(bool *)((long)puVar39 + 0x2c);
                      local_328._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&local_328,&degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_13,iVar26),uVar36,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_328);
                    uVar11 = result_1.m_backend._48_8_;
                  }
                }
              }
              else {
                iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&local_628);
                if (iVar26 < 1) {
                  goto LAB_002cebe3;
                }
                pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_638 + lVar38);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_1.m_backend,pcVar30);
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      result_1.m_backend.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_1.m_backend != pcVar30) {
                    uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                    result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                    result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                    result_1.m_backend.data._M_elems._0_16_ =
                         *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                    result_1.m_backend.data._M_elems._16_8_ =
                         *(undefined8 *)((pcVar30->data)._M_elems + 4);
                    uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                    result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                    result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                    result_1.m_backend.exp = pcVar30->exp;
                    result_1.m_backend.neg = pcVar30->neg;
                    result_1.m_backend.fpclass = pcVar30->fpclass;
                    result_1.m_backend.prec_elem = pcVar30->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)
                            );
                }
                local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
                local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
                local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_758.exp = result_1.m_backend.exp;
                local_758.neg = result_1.m_backend.neg;
                local_758.fpclass = result_1.m_backend.fpclass;
                local_758.prec_elem = result_1.m_backend.prec_elem;
                result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
                result_1.m_backend.data._M_elems[9]._1_3_ =
                     degeneps.m_backend.data._M_elems[9]._1_3_;
                result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
                result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
                result_1.m_backend.data._M_elems._24_5_ = degeneps.m_backend.data._M_elems._24_5_;
                result_1.m_backend.data._M_elems[7]._1_3_ =
                     degeneps.m_backend.data._M_elems[7]._1_3_;
                result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
                result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
                result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
                auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                uVar12._4_4_ = degeneps.m_backend.prec_elem;
                uVar12._0_4_ = degeneps.m_backend.fpclass;
                result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                fVar27 = result_1.m_backend.fpclass;
                result_1.m_backend.data._M_elems._0_16_ = auVar17;
                result_1.m_backend._48_8_ = uVar12;
                if ((fVar27 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                   || (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                compare(&local_758,&result_1.m_backend), -1 < iVar26)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_758,&local_798);
                  uVar11 = result_1.m_backend._48_8_;
                  if (((local_758.fpclass != cpp_dec_float_NaN) &&
                      ((local_5a8.fpclass != cpp_dec_float_NaN &&
                       (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_758,&local_5a8), uVar11 = result_1.m_backend._48_8_,
                       iVar26 < 1)))) &&
                     ((local_798.fpclass != cpp_dec_float_NaN &&
                      ((local_678.fpclass != cpp_dec_float_NaN &&
                       (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_798,&local_678), uVar11 = result_1.m_backend._48_8_,
                       -1 < iVar26)))))) {
                    iVar26 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_11,iVar26),uVar36);
                    local_678.neg = local_798.neg;
                    uVar11 = result_1.m_backend._48_8_;
                    local_7a0 = uVar36;
                    local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                    local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                    local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                    local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                    local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                    local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                    local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                    local_718.exp = local_758.exp;
                    local_718.neg = local_758.neg;
                    local_718._48_8_ = local_758._48_8_;
                    local_678.data._M_elems[0] = local_798.data._M_elems[0];
                    local_678.data._M_elems[1] = local_798.data._M_elems[1];
                    local_678.data._M_elems[2] = local_798.data._M_elems[2];
                    local_678.data._M_elems[3] = local_798.data._M_elems[3];
                    local_678.data._M_elems[4] = local_798.data._M_elems[4];
                    local_678.data._M_elems[5] = local_798.data._M_elems[5];
                    local_678.data._M_elems[6] = local_798.data._M_elems[6];
                    local_678.data._M_elems[7] = local_798.data._M_elems[7];
                    local_678.data._M_elems[8] = local_798.data._M_elems[8];
                    local_678.data._M_elems[9] = local_798.data._M_elems[9];
                    local_678.exp = local_798.exp;
                    local_678._48_8_ = local_798._48_8_;
                  }
                }
                else {
                  iVar26 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  puVar39 = (undefined1 *)(lVar38 + *plVar5);
                  local_2e8.fpclass = cpp_dec_float_finite;
                  local_2e8.prec_elem = 10;
                  local_2e8.data._M_elems[8] = 0;
                  local_2e8.data._M_elems[9] = 0;
                  local_2e8.exp = 0;
                  local_2e8.neg = false;
                  local_2e8.data._M_elems[4] = 0;
                  local_2e8.data._M_elems[5] = 0;
                  local_2e8.data._M_elems._24_5_ = 0;
                  local_2e8.data._M_elems[7]._1_3_ = 0;
                  local_2e8.data._M_elems[0] = 0;
                  local_2e8.data._M_elems[1] = 0;
                  local_2e8.data._M_elems[2] = 0;
                  local_2e8.data._M_elems[3] = 0;
                  if (&local_2e8 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                    local_2e8.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                    local_2e8.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                    local_2e8.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                    local_2e8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                    local_2e8.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                    local_2e8.exp = *(int *)((long)puVar39 + 0x28);
                    local_2e8.neg = *(bool *)((long)puVar39 + 0x2c);
                    local_2e8._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_2e8,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_12,iVar26),uVar36,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_2e8);
                  uVar11 = result_1.m_backend._48_8_;
                }
              }
              result_1.m_backend._48_8_ = uVar11;
              uVar40 = uVar40 - 1;
            } while (1 < uVar40);
          }
          if (0 < (long)*(int *)(lVar8 + 0x58)) {
            local_79c = 0xffffffff;
            uVar40 = (long)*(int *)(lVar8 + 0x58);
            do {
              lVar35 = *(long *)(lVar8 + 0x70);
              iVar26 = *(int *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4);
              lVar38 = (long)iVar26 * 0x38;
              local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              uVar11 = *(undefined8 *)(lVar35 + lVar38);
              uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
              puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
              uVar13 = *puVar1;
              uVar14 = puVar1[1];
              uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_798.data._M_elems[8] = (uint)uVar34;
              local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
              local_798.data._M_elems[4] = (uint)uVar13;
              local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
              local_798.data._M_elems[6] = (uint)uVar14;
              local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
              local_798.data._M_elems[0] = (uint)uVar11;
              local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
              local_798.data._M_elems[2] = (uint)uVar12;
              local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
              if (local_5e8.fpclass == cpp_dec_float_NaN || local_798.fpclass == cpp_dec_float_NaN)
              {
LAB_002cf48f:
                result_1.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
                result_1.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
                result_1.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
                result_1.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
                auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                result_1.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
                result_1.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
                result_1.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
                result_1.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
                result_1.m_backend.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
                result_1.m_backend.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
                result_1.m_backend.exp = local_5e8.exp;
                result_1.m_backend.neg = local_5e8.neg;
                result_1.m_backend.prec_elem = local_5e8.prec_elem;
                result_1.m_backend.fpclass = local_5e8.fpclass;
                result_1.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    local_5e8.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(local_5e8.neg ^ 1);
                }
                result_1.m_backend.data._M_elems._0_16_ = auVar17;
                if (((local_5e8.fpclass == cpp_dec_float_NaN) ||
                    (local_798.fpclass == cpp_dec_float_NaN)) ||
                   (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&result_1.m_backend), -1 < iVar28)) {
                  lVar35 = *(long *)(lVar8 + 0x70);
                  lVar38 = (long)*(int *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4) * 0x38;
                  *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
                  *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
                  iVar26 = *(int *)(lVar8 + 0x58);
                  *(int *)(lVar8 + 0x58) = iVar26 + -1;
                  *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4) =
                       *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + (long)iVar26 * 4);
                  uVar13 = result_1.m_backend._48_8_;
                }
                else {
                  pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar38);
                  result_1.m_backend.fpclass = cpp_dec_float_finite;
                  result_1.m_backend.prec_elem = 10;
                  result_1.m_backend.data._M_elems[0] = 0;
                  result_1.m_backend.data._M_elems[1] = 0;
                  result_1.m_backend.data._M_elems[2] = 0;
                  result_1.m_backend.data._M_elems[3] = 0;
                  result_1.m_backend.data._M_elems[4] = 0;
                  result_1.m_backend.data._M_elems[5] = 0;
                  result_1.m_backend.data._M_elems._24_5_ = 0;
                  result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                  result_1.m_backend.data._M_elems._32_5_ = 0;
                  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                  result_1.m_backend.exp = 0;
                  result_1.m_backend.neg = false;
                  if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38)) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&result_1.m_backend,pcVar30);
                    if (result_1.m_backend.data._M_elems[0] != 0 ||
                        result_1.m_backend.fpclass != cpp_dec_float_finite) {
                      result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                    }
                  }
                  else {
                    if (&result_1.m_backend != pcVar30) {
                      uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                      result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                      result_1.m_backend.data._M_elems[9]._1_3_ =
                           (undefined3)((ulong)uVar34 >> 0x28);
                      result_1.m_backend.data._M_elems._0_16_ =
                           *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                      result_1.m_backend.data._M_elems._16_8_ =
                           *(undefined8 *)((pcVar30->data)._M_elems + 4);
                      uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                      result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                      result_1.m_backend.data._M_elems[7]._1_3_ =
                           (undefined3)((ulong)uVar34 >> 0x28);
                      result_1.m_backend.exp = pcVar30->exp;
                      result_1.m_backend.neg = pcVar30->neg;
                      result_1.m_backend.fpclass = pcVar30->fpclass;
                      result_1.m_backend.prec_elem = pcVar30->prec_elem;
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&result_1.m_backend,
                               (cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38));
                  }
                  auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                  local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                  local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                  local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                  local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                  local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
                  local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
                  local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                  local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                  local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                  local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                  local_758.exp = result_1.m_backend.exp;
                  local_758.neg = result_1.m_backend.neg;
                  local_758.fpclass = result_1.m_backend.fpclass;
                  local_758.prec_elem = result_1.m_backend.prec_elem;
                  result_1.m_backend.data._M_elems._0_16_ = auVar17;
                  if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
                     (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&local_758,&degeneps.m_backend), iVar28 < 1)) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                              (&local_758,&local_798);
                    uVar13 = result_1.m_backend._48_8_;
                    if (((local_758.fpclass != cpp_dec_float_NaN) &&
                        (local_5a8.fpclass != cpp_dec_float_NaN)) &&
                       (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_758,&local_5a8), uVar13 = result_1.m_backend._48_8_,
                       iVar28 < 1)) {
                      result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                      result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                      result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                      result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                      result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                      result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                      result_1.m_backend.data._M_elems._32_5_ =
                           SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                      result_1.m_backend.data._M_elems[9]._1_3_ =
                           (undefined3)(local_798.data._M_elems[9] >> 8);
                      result_1.m_backend.data._M_elems._24_5_ =
                           SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
                      result_1.m_backend.data._M_elems[7]._1_3_ =
                           (undefined3)(local_798.data._M_elems[7] >> 8);
                      result_1.m_backend.exp = local_798.exp;
                      result_1.m_backend.neg = local_798.neg;
                      uVar13._0_4_ = local_798.fpclass;
                      uVar13._4_4_ = local_798.prec_elem;
                      result_1.m_backend.fpclass = local_798.fpclass;
                      result_1.m_backend.prec_elem = local_798.prec_elem;
                      if (local_798.data._M_elems[0] != 0 ||
                          local_798.fpclass != cpp_dec_float_finite) {
                        result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
                      }
                      if (((local_798.fpclass != cpp_dec_float_NaN) &&
                          (uVar13 = result_1.m_backend._48_8_,
                          local_678.fpclass != cpp_dec_float_NaN)) &&
                         (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&result_1.m_backend,&local_678),
                         uVar13 = result_1.m_backend._48_8_, -1 < iVar28)) {
                        iVar28 = (*(this->
                                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   )._vptr_SPxRatioTester[3])();
                        enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)CONCAT44(extraout_var_18,iVar28),iVar26);
                        local_678.neg =
                             (bool)((local_798.data._M_elems[0] != 0 ||
                                    local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                        goto LAB_002cfc17;
                      }
                    }
                  }
                  else {
                    iVar28 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    puVar39 = (undefined1 *)(lVar38 + *plVar7);
                    local_3a8.fpclass = cpp_dec_float_finite;
                    local_3a8.prec_elem = 10;
                    local_3a8.data._M_elems[8] = 0;
                    local_3a8.data._M_elems[9] = 0;
                    local_3a8.exp = 0;
                    local_3a8.neg = false;
                    local_3a8.data._M_elems[4] = 0;
                    local_3a8.data._M_elems[5] = 0;
                    local_3a8.data._M_elems._24_5_ = 0;
                    local_3a8.data._M_elems[7]._1_3_ = 0;
                    local_3a8.data._M_elems[0] = 0;
                    local_3a8.data._M_elems[1] = 0;
                    local_3a8.data._M_elems[2] = 0;
                    local_3a8.data._M_elems[3] = 0;
                    if (&local_3a8 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                      local_3a8.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                      local_3a8.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                      local_3a8.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                      local_3a8.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                      local_3a8.data._M_elems[7]._1_3_ =
                           (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                      local_3a8.exp = *(int *)((long)puVar39 + 0x28);
                      local_3a8.neg = *(bool *)((long)puVar39 + 0x2c);
                      local_3a8._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&local_3a8,&degeneps.m_backend);
                    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_17,iVar28),iVar26,
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_3a8);
                    uVar13 = result_1.m_backend._48_8_;
                  }
                }
              }
              else {
                iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&local_5e8);
                if (iVar28 < 1) {
                  goto LAB_002cf48f;
                }
                pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*plVar9 + lVar38);
                result_1.m_backend.fpclass = cpp_dec_float_finite;
                result_1.m_backend.prec_elem = 10;
                result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
                result_1.m_backend.data._M_elems[4] = 0;
                result_1.m_backend.data._M_elems[5] = 0;
                result_1.m_backend.data._M_elems._24_5_ = 0;
                result_1.m_backend.data._M_elems[7]._1_3_ = 0;
                result_1.m_backend.data._M_elems._32_5_ = 0;
                result_1.m_backend.data._M_elems[9]._1_3_ = 0;
                result_1.m_backend.exp = 0;
                result_1.m_backend.neg = false;
                if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_1.m_backend,pcVar30);
                  if (result_1.m_backend.data._M_elems[0] != 0 ||
                      result_1.m_backend.fpclass != cpp_dec_float_finite) {
                    result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                  }
                }
                else {
                  if (&result_1.m_backend != pcVar30) {
                    uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                    result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                    result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                    result_1.m_backend.data._M_elems._0_16_ =
                         *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                    result_1.m_backend.data._M_elems._16_8_ =
                         *(undefined8 *)((pcVar30->data)._M_elems + 4);
                    uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                    result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                    result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                    result_1.m_backend.exp = pcVar30->exp;
                    result_1.m_backend.neg = pcVar30->neg;
                    result_1.m_backend.fpclass = pcVar30->fpclass;
                    result_1.m_backend.prec_elem = pcVar30->prec_elem;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38)
                            );
                }
                local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
                local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
                local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
                local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
                local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
                local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
                local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
                local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
                local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
                local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
                local_758.exp = result_1.m_backend.exp;
                local_758.neg = result_1.m_backend.neg;
                local_758.fpclass = result_1.m_backend.fpclass;
                local_758.prec_elem = result_1.m_backend.prec_elem;
                result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
                result_1.m_backend.data._M_elems[9]._1_3_ =
                     degeneps.m_backend.data._M_elems[9]._1_3_;
                result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
                result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
                result_1.m_backend.data._M_elems._24_5_ = degeneps.m_backend.data._M_elems._24_5_;
                result_1.m_backend.data._M_elems[7]._1_3_ =
                     degeneps.m_backend.data._M_elems[7]._1_3_;
                result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
                result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
                result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
                auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
                result_1.m_backend.exp = degeneps.m_backend.exp;
                result_1.m_backend.neg = degeneps.m_backend.neg;
                uVar14._4_4_ = degeneps.m_backend.prec_elem;
                uVar14._0_4_ = degeneps.m_backend.fpclass;
                result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
                }
                fVar27 = result_1.m_backend.fpclass;
                result_1.m_backend.data._M_elems._0_16_ = auVar17;
                result_1.m_backend._48_8_ = uVar14;
                if ((fVar27 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                   || (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                compare(&local_758,&result_1.m_backend), -1 < iVar28)) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                            (&local_758,&local_798);
                  uVar13 = result_1.m_backend._48_8_;
                  if (((local_758.fpclass == cpp_dec_float_NaN) ||
                      ((local_5a8.fpclass == cpp_dec_float_NaN ||
                       (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_758,&local_5a8), uVar13 = result_1.m_backend._48_8_,
                       0 < iVar28)))) ||
                     ((local_798.fpclass == cpp_dec_float_NaN ||
                      ((local_678.fpclass == cpp_dec_float_NaN ||
                       (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&local_798,&local_678), uVar13 = result_1.m_backend._48_8_,
                       iVar28 < 0)))))) goto LAB_002cf559;
                  iVar28 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_15,iVar28),iVar26);
                  local_678.neg = local_798.neg;
LAB_002cfc17:
                  local_79c = (uint)(uVar40 - 1);
                  uVar13 = result_1.m_backend._48_8_;
                  local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                  local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                  local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                  local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                  local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                  local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                  local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                  local_718.exp = local_758.exp;
                  local_718.neg = local_758.neg;
                  local_718._48_8_ = local_758._48_8_;
                  local_678.data._M_elems[0] = local_798.data._M_elems[0];
                  local_678.data._M_elems[1] = local_798.data._M_elems[1];
                  local_678.data._M_elems[2] = local_798.data._M_elems[2];
                  local_678.data._M_elems[3] = local_798.data._M_elems[3];
                  local_678.data._M_elems[4] = local_798.data._M_elems[4];
                  local_678.data._M_elems[5] = local_798.data._M_elems[5];
                  local_678.data._M_elems[6] = local_798.data._M_elems[6];
                  local_678.data._M_elems[7] = local_798.data._M_elems[7];
                  local_678.data._M_elems[8] = local_798.data._M_elems[8];
                  local_678.data._M_elems[9] = local_798.data._M_elems[9];
                  local_678.exp = local_798.exp;
                  local_678._48_8_ = local_798._48_8_;
                }
                else {
                  iVar28 = (*(this->
                             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._vptr_SPxRatioTester[3])();
                  puVar39 = (undefined1 *)(lVar38 + *plVar7);
                  local_368.fpclass = cpp_dec_float_finite;
                  local_368.prec_elem = 10;
                  local_368.data._M_elems[8] = 0;
                  local_368.data._M_elems[9] = 0;
                  local_368.exp = 0;
                  local_368.neg = false;
                  local_368.data._M_elems[4] = 0;
                  local_368.data._M_elems[5] = 0;
                  local_368.data._M_elems._24_5_ = 0;
                  local_368.data._M_elems[7]._1_3_ = 0;
                  local_368.data._M_elems[0] = 0;
                  local_368.data._M_elems[1] = 0;
                  local_368.data._M_elems[2] = 0;
                  local_368.data._M_elems[3] = 0;
                  if (&local_368 != (cpp_dec_float<50U,_int,_void> *)puVar39) {
                    local_368.data._M_elems._32_8_ = *(undefined8 *)(puVar39 + 0x20);
                    local_368.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar39;
                    local_368.data._M_elems._16_8_ = *(undefined8 *)(puVar39 + 0x10);
                    local_368.data._M_elems._24_5_ = SUB85(*(undefined8 *)(puVar39 + 0x18),0);
                    local_368.data._M_elems[7]._1_3_ =
                         (undefined3)((ulong)*(undefined8 *)(puVar39 + 0x18) >> 0x28);
                    local_368.exp = *(int *)((long)puVar39 + 0x28);
                    local_368.neg = *(bool *)((long)puVar39 + 0x2c);
                    local_368._48_8_ = *(undefined8 *)((long)puVar39 + 0x30);
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&local_368,&degeneps.m_backend);
                  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)CONCAT44(extraout_var_16,iVar28),iVar26,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_368);
                  uVar13 = result_1.m_backend._48_8_;
                }
              }
LAB_002cf559:
              result_1.m_backend._48_8_ = uVar13;
              bVar25 = 1 < uVar40;
              uVar40 = uVar40 - 1;
            } while (bVar25);
          }
          iVar26 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          (**(code **)(*(long *)CONCAT44(extraout_var_19,iVar26) + 0x368))
                    (&result_1,(long *)CONCAT44(extraout_var_19,iVar26));
        } while (((local_4a8.fpclass == cpp_dec_float_NaN) ||
                 (result_1.m_backend.fpclass == cpp_dec_float_NaN)) ||
                (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    (&local_4a8,&result_1.m_backend), iVar26 != 0));
        if (-1 < (int)local_79c) {
          iVar26 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          bVar25 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_20,iVar26),&enterId);
          if (!bVar25) goto LAB_002d0546;
          lVar35 = *(long *)(lVar8 + 0x70);
          lVar38 = (long)*(int *)(*(long *)(lVar8 + 0x60) + (ulong)local_79c * 4) * 0x38;
          *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
          *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
          *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
          iVar26 = *(int *)(lVar8 + 0x58);
          *(int *)(lVar8 + 0x58) = iVar26 + -1;
          *(undefined4 *)(*(long *)(lVar8 + 0x60) + (ulong)local_79c * 4) =
               *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + (long)iVar26 * 4);
          goto LAB_002ce4eb;
        }
        if ((int)local_7a0 < 0) goto LAB_002d2319;
        iVar26 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar35 = *(long *)(CONCAT44(extraout_var_21,iVar26) + 0x790);
        lVar38 = *(long *)(lVar35 + 0x20);
        lVar35 = (long)*(int *)(*(long *)(lVar35 + 0x28) + 4 + (ulong)local_7a0 * 8);
        result_1.m_backend.fpclass = cpp_dec_float_finite;
        result_1.m_backend.prec_elem = 10;
        result_1.m_backend.data._M_elems[0] = 0;
        result_1.m_backend.data._M_elems[1] = 0;
        result_1.m_backend.data._M_elems[2] = 0;
        result_1.m_backend.data._M_elems[3] = 0;
        result_1.m_backend.data._M_elems[4] = 0;
        result_1.m_backend.data._M_elems[5] = 0;
        result_1.m_backend.data._M_elems._24_5_ = 0;
        result_1.m_backend.data._M_elems[7]._1_3_ = 0;
        result_1.m_backend.data._M_elems._32_5_ = 0;
        result_1.m_backend.data._M_elems[9]._1_3_ = 0;
        result_1.m_backend.exp = 0;
        result_1.m_backend.neg = false;
        iVar26 = *(int *)(lVar38 + 0xc + lVar35 * 0x28);
        if (0 < iVar26) {
          pcVar30 = *(cpp_dec_float<50U,_int,_void> **)(lVar38 + lVar35 * 0x28);
          uVar36 = iVar26 + 1;
          do {
            pcVar31 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)(int)pcVar30[1].data._M_elems[0] * 0x38 + *plVar7);
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems._24_5_ = 0;
            result.m_backend.data._M_elems[7]._1_3_ = 0;
            result.m_backend.data._M_elems._32_5_ = 0;
            result.m_backend.data._M_elems[9]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            pcVar37 = pcVar30;
            if ((&result.m_backend != pcVar31) && (pcVar37 = pcVar31, pcVar30 != &result.m_backend))
            {
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
              result.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
              result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar30->data)._M_elems
              ;
              result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar30->data)._M_elems + 4);
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
              result.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
              result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result.m_backend.exp = pcVar30->exp;
              result.m_backend.neg = pcVar30->neg;
              result.m_backend.fpclass = pcVar30->fpclass;
              result.m_backend.prec_elem = pcVar30->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&result.m_backend,pcVar37);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&result_1.m_backend,&result.m_backend);
            pcVar30 = (cpp_dec_float<50U,_int,_void> *)(pcVar30[1].data._M_elems + 1);
            uVar36 = uVar36 - 1;
          } while (1 < uVar36);
        }
        result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
        uVar36 = result_1.m_backend.data._M_elems[0];
        uVar18 = result_1.m_backend.data._M_elems[1];
        uVar19 = result_1.m_backend.data._M_elems[2];
        uVar20 = result_1.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
        lVar35 = *plVar5;
        lVar38 = (ulong)local_7a0 * 0x38;
        *(ulong *)(lVar35 + 0x20 + lVar38) =
             CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                      result_1.m_backend.data._M_elems._32_5_);
        puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
        *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar2 + 2) =
             CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,
                      result_1.m_backend.data._M_elems._24_5_);
        puVar2 = (uint *)(lVar35 + lVar38);
        *puVar2 = uVar36;
        puVar2[1] = uVar18;
        puVar2[2] = uVar19;
        puVar2[3] = uVar20;
        *(int *)(lVar35 + 0x28 + lVar38) = result_1.m_backend.exp;
        *(bool *)(lVar35 + 0x2c + lVar38) = result_1.m_backend.neg;
        *(undefined8 *)(lVar35 + 0x30 + lVar38) = result_1.m_backend._48_8_;
        iVar26 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        bVar25 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_22,iVar26),&enterId);
        if (bVar25) {
          local_38 = 0xa00000000;
          local_68[0] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[1] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[2] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[3] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[4] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[5] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[6] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[7] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[8] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[9] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[10] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[0xb] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[0xc] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[0xd] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[0xe] = (cpp_dec_float<50u,int,void>)0x0;
          local_68[0xf] = (cpp_dec_float<50u,int,void>)0x0;
          local_58 = SUB1613((undefined1  [16])0x0,0);
          uStack_4b = 0;
          auStack_48 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_68,0.0);
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(lVar6 + 0x50),local_7a0,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_68);
          goto LAB_002ce4eb;
        }
        lVar35 = *(long *)(lVar6 + 0x70);
        local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
        local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
        local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
        uVar11 = *(undefined8 *)(lVar35 + lVar38);
        uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
        puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
        uVar13 = *puVar1;
        uVar14 = puVar1[1];
        uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
        local_798.data._M_elems[8] = (uint)uVar34;
        local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
        local_798.data._M_elems[4] = (uint)uVar13;
        local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
        local_798.data._M_elems[6] = (uint)uVar14;
        local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
        local_798.data._M_elems[0] = (uint)uVar11;
        local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
        local_798.data._M_elems[2] = (uint)uVar12;
        local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
        if (local_798.fpclass == cpp_dec_float_NaN) {
LAB_002d002d:
          pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_640 + lVar38);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_1.m_backend,pcVar30);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_1.m_backend != pcVar30) {
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
              result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
              result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result_1.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pcVar30->data)._M_elems;
              result_1.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pcVar30->data)._M_elems + 4);
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
              result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
              result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result_1.m_backend.exp = pcVar30->exp;
              result_1.m_backend.neg = pcVar30->neg;
              result_1.m_backend.fpclass = pcVar30->fpclass;
              result_1.m_backend.prec_elem = pcVar30->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
          }
          local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_718.exp = result_1.m_backend.exp;
          local_718.neg = result_1.m_backend.neg;
          local_718.fpclass = result_1.m_backend.fpclass;
          local_718.prec_elem = result_1.m_backend.prec_elem;
          result_1.m_backend.data._M_elems._32_5_ =
               SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
          result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_798.data._M_elems[9] >> 8);
          result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
          result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
          result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
          result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
          result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
          result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
          result_1.m_backend.data._M_elems._24_5_ =
               SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
          result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_798.data._M_elems[7] >> 8);
          result_1.m_backend.exp = local_798.exp;
          result_1.m_backend.neg = local_798.neg;
          result_1.m_backend.fpclass = local_798.fpclass;
          result_1.m_backend.prec_elem = local_798.prec_elem;
          if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite) {
            result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
          }
          if (((local_798.fpclass != cpp_dec_float_NaN) &&
              (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&result_1.m_backend,&minStability.m_backend), iVar26 < 0)) {
            result.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
            result.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
            result.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
            result.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
            auVar17 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
            result.m_backend.data._M_elems._32_5_ = local_718.data._M_elems._32_5_;
            result.m_backend.data._M_elems[9]._1_3_ = local_718.data._M_elems[9]._1_3_;
            result.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
            result.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
            result.m_backend.data._M_elems._24_5_ = local_718.data._M_elems._24_5_;
            result.m_backend.data._M_elems[7]._1_3_ = local_718.data._M_elems[7]._1_3_;
            result.m_backend.exp = local_718.exp;
            result.m_backend.neg = local_718.neg;
            result.m_backend.fpclass = local_718.fpclass;
            result.m_backend.prec_elem = local_718.prec_elem;
            result.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
            if (result.m_backend.data._M_elems[0] != 0 || local_718.fpclass != cpp_dec_float_finite)
            {
              result.m_backend.neg = (bool)(local_718.neg ^ 1);
            }
            result.m_backend.data._M_elems._0_16_ = auVar17;
            if (((local_718.fpclass != cpp_dec_float_NaN) &&
                ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
               (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&result.m_backend,local_630), iVar26 < 0)) {
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&result_1,2.0);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&minStability.m_backend,&result_1.m_backend);
              iVar26 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar35 = *plVar5;
              local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
              local_128.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
              puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
              local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_128.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_128.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_128.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_23,iVar26),local_7a0,&local_128);
              goto LAB_002ce4eb;
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&result_1.m_backend,0,(type *)0x0);
          iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_798,&result_1.m_backend);
          if (iVar26 < 1) goto LAB_002d002d;
          pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_638 + lVar38);
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 10;
          result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems._24_5_ = 0;
          result_1.m_backend.data._M_elems[7]._1_3_ = 0;
          result_1.m_backend.data._M_elems._32_5_ = 0;
          result_1.m_backend.data._M_elems[9]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_1.m_backend,pcVar30);
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                result_1.m_backend.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            if (&result_1.m_backend != pcVar30) {
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
              result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
              result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result_1.m_backend.data._M_elems._0_16_ =
                   *(undefined1 (*) [16])(pcVar30->data)._M_elems;
              result_1.m_backend.data._M_elems._16_8_ =
                   *(undefined8 *)((pcVar30->data)._M_elems + 4);
              uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
              result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
              result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
              result_1.m_backend.exp = pcVar30->exp;
              result_1.m_backend.neg = pcVar30->neg;
              result_1.m_backend.fpclass = pcVar30->fpclass;
              result_1.m_backend.prec_elem = pcVar30->prec_elem;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
          }
          auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
          local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
          local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
          local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
          local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
          local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
          local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
          local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
          local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
          local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
          local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
          local_718.exp = result_1.m_backend.exp;
          local_718.neg = result_1.m_backend.neg;
          local_718.fpclass = result_1.m_backend.fpclass;
          local_718.prec_elem = result_1.m_backend.prec_elem;
          result_1.m_backend.data._M_elems._0_16_ = auVar17;
          if (((local_798.fpclass != cpp_dec_float_NaN) &&
              (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
             (((iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&minStability.m_backend), iVar26 < 0 &&
               ((local_718.fpclass != cpp_dec_float_NaN &&
                ((this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
              (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_718,local_630), iVar26 < 0)))) {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&result_1,2.0);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                      (&minStability.m_backend,&result_1.m_backend);
            iVar26 = (*(this->
                       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       )._vptr_SPxRatioTester[3])();
            lVar35 = *plVar5;
            local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
            local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
            puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
            local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
            local_e8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
            local_e8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
            local_e8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(extraout_var_24,iVar26),local_7a0,&local_e8);
            goto LAB_002ce4eb;
          }
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                  (&local_718,&local_798);
        if (((local_718.fpclass == cpp_dec_float_NaN) || (local_5a8.fpclass == cpp_dec_float_NaN))
           || (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&local_718,&local_5a8), iVar26 < 1)) goto LAB_002d0546;
      } while( true );
    }
  }
  result_1.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
  result_1.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
  result_1.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  result_1.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
  auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
  result_1.m_backend.data._M_elems._32_5_ = epsilon.m_backend.data._M_elems._32_5_;
  result_1.m_backend.data._M_elems[9]._1_3_ = epsilon.m_backend.data._M_elems[9]._1_3_;
  result_1.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
  result_1.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
  result_1.m_backend.data._M_elems._24_5_ = epsilon.m_backend.data._M_elems._24_5_;
  result_1.m_backend.data._M_elems[7]._1_3_ = epsilon.m_backend.data._M_elems[7]._1_3_;
  result_1.m_backend.exp = epsilon.m_backend.exp;
  result_1.m_backend.neg = epsilon.m_backend.neg;
  result_1.m_backend.prec_elem = epsilon.m_backend.prec_elem;
  result_1.m_backend.fpclass = epsilon.m_backend.fpclass;
  result_1.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
  if (result_1.m_backend.data._M_elems[0] != 0 || epsilon.m_backend.fpclass != cpp_dec_float_finite)
  {
    result_1.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
  }
  if (((epsilon.m_backend.fpclass == cpp_dec_float_NaN) ||
      ((val->m_backend).fpclass == cpp_dec_float_NaN)) ||
     (result_1.m_backend.data._M_elems._0_16_ = auVar17,
     iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&val->m_backend,&result_1.m_backend), -1 < iVar26)) {
LAB_002d0546:
    *(ulong *)((val->m_backend).data._M_elems + 8) =
         CONCAT35(local_718.data._M_elems[9]._1_3_,local_718.data._M_elems._32_5_);
    *(undefined8 *)((val->m_backend).data._M_elems + 4) = local_718.data._M_elems._16_8_;
    *(ulong *)((val->m_backend).data._M_elems + 6) =
         CONCAT35(local_718.data._M_elems[7]._1_3_,local_718.data._M_elems._24_5_);
    *(undefined8 *)(val->m_backend).data._M_elems = local_718.data._M_elems._0_8_;
    *(undefined8 *)((val->m_backend).data._M_elems + 2) = local_718.data._M_elems._8_8_;
    (val->m_backend).exp = local_718.exp;
    (val->m_backend).neg = local_718.neg;
    (val->m_backend).fpclass = local_718.fpclass;
    (val->m_backend).prec_elem = local_718.prec_elem;
    return (SPxId)enterId.super_DataKey;
  }
  pdVar29 = (double *)__tls_get_addr(&PTR_003b4b70);
  dVar3 = *pdVar29;
  local_630 = &(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).delta.m_backend;
LAB_002d05df:
  do {
    do {
      uVar34 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_5a8.data._M_elems._32_5_ = SUB85(uVar34,0);
      local_5a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
      local_5a8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_5a8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_5a8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
      local_5a8.data._M_elems[6] = (val->m_backend).data._M_elems[6];
      local_5a8.data._M_elems[7] = (val->m_backend).data._M_elems[7];
      local_5a8.exp = (val->m_backend).exp;
      local_5a8.neg = (val->m_backend).neg;
      local_5a8.fpclass = (val->m_backend).fpclass;
      local_5a8.prec_elem = (val->m_backend).prec_elem;
      iVar26 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])(this);
      (**(code **)(*(long *)CONCAT44(extraout_var_25,iVar26) + 0x368))
                (&result_1,(long *)CONCAT44(extraout_var_25,iVar26));
      auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
      local_4a8.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_4a8.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_4a8.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_4a8.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_4a8.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
      local_4a8.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
      local_4a8.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_4a8.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_4a8.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_4a8.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_4a8.exp = result_1.m_backend.exp;
      local_4a8.neg = result_1.m_backend.neg;
      local_4a8.fpclass = result_1.m_backend.fpclass;
      local_4a8.prec_elem = result_1.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_16_ = auVar17;
      minDelta(this,&rmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5a8,*(int *)(lVar6 + 0x58),*(int **)(lVar6 + 0x60),
               *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar6 + 0x70),
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar5,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_640,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*local_638);
      minDelta(this,&cmaxabs,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_5a8,*(int *)(lVar8 + 0x58),*(int **)(lVar8 + 0x60),
               *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 **)(lVar8 + 0x70),
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar7,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar10,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)*plVar9);
      if (((local_5a8.fpclass != cpp_dec_float_NaN) &&
          ((val->m_backend).fpclass != cpp_dec_float_NaN)) &&
         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_5a8,&val->m_backend), iVar26 == 0)) {
        uVar32._0_4_ = enterId.super_DataKey.info;
        uVar32._4_4_ = enterId.super_DataKey.idx;
        return (SPxId)uVar32;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_678,0);
      ::soplex::infinity::__tls_init();
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_1,dVar3);
      auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
      local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
      local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
      local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_718.exp = result_1.m_backend.exp;
      local_718.neg = result_1.m_backend.neg;
      local_718.fpclass = result_1.m_backend.fpclass;
      local_718.prec_elem = result_1.m_backend.prec_elem;
      result_10.m_backend.data._M_elems[8] = rmaxabs.m_backend.data._M_elems[8];
      result_10.m_backend.data._M_elems[9] = rmaxabs.m_backend.data._M_elems[9];
      result_10.m_backend.data._M_elems[4] = rmaxabs.m_backend.data._M_elems[4];
      result_10.m_backend.data._M_elems[5] = rmaxabs.m_backend.data._M_elems[5];
      result_10.m_backend.data._M_elems[6] = rmaxabs.m_backend.data._M_elems[6];
      result_10.m_backend.data._M_elems[7] = rmaxabs.m_backend.data._M_elems[7];
      result_10.m_backend.data._M_elems[0] = rmaxabs.m_backend.data._M_elems[0];
      result_10.m_backend.data._M_elems[1] = rmaxabs.m_backend.data._M_elems[1];
      result_10.m_backend.data._M_elems[2] = rmaxabs.m_backend.data._M_elems[2];
      result_10.m_backend.data._M_elems[3] = rmaxabs.m_backend.data._M_elems[3];
      result_10.m_backend.exp = rmaxabs.m_backend.exp;
      result_10.m_backend.neg = rmaxabs.m_backend.neg;
      result_10.m_backend.fpclass = rmaxabs.m_backend.fpclass;
      result_10.m_backend.prec_elem = rmaxabs.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_16_ = auVar17;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_10.m_backend,&epsilon.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_1,0.001);
      result.m_backend.data._M_elems[0] = result_10.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = result_10.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[2] = result_10.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = result_10.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[4] = result_10.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = result_10.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems._24_5_ = result_10.m_backend.data._M_elems._24_5_;
      result.m_backend.data._M_elems[7]._1_3_ = result_10.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems._32_5_ = result_10.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = result_10.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.exp = result_10.m_backend.exp;
      result.m_backend.neg = result_10.m_backend.neg;
      result.m_backend.fpclass = result_10.m_backend.fpclass;
      result.m_backend.prec_elem = result_10.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,&result_1.m_backend);
      local_628.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_628.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_628.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_628.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_628.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_628.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_628.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_628.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_628.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_628.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_628.exp = result.m_backend.exp;
      local_628.neg = result.m_backend.neg;
      local_628.fpclass = result.m_backend.fpclass;
      local_628.prec_elem = result.m_backend.prec_elem;
      result_10.m_backend.data._M_elems[8] = cmaxabs.m_backend.data._M_elems[8];
      result_10.m_backend.data._M_elems[9] = cmaxabs.m_backend.data._M_elems[9];
      result_10.m_backend.data._M_elems[4] = cmaxabs.m_backend.data._M_elems[4];
      result_10.m_backend.data._M_elems[5] = cmaxabs.m_backend.data._M_elems[5];
      result_10.m_backend.data._M_elems[6] = cmaxabs.m_backend.data._M_elems[6];
      result_10.m_backend.data._M_elems[7] = cmaxabs.m_backend.data._M_elems[7];
      result_10.m_backend.data._M_elems[0] = cmaxabs.m_backend.data._M_elems[0];
      result_10.m_backend.data._M_elems[1] = cmaxabs.m_backend.data._M_elems[1];
      result_10.m_backend.data._M_elems[2] = cmaxabs.m_backend.data._M_elems[2];
      result_10.m_backend.data._M_elems[3] = cmaxabs.m_backend.data._M_elems[3];
      result_10.m_backend.exp = cmaxabs.m_backend.exp;
      result_10.m_backend.neg = cmaxabs.m_backend.neg;
      result_10.m_backend.fpclass = cmaxabs.m_backend.fpclass;
      result_10.m_backend.prec_elem = cmaxabs.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result_10.m_backend,&epsilon.m_backend);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 10;
      result.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems._24_5_ = 0;
      result.m_backend.data._M_elems[7]._1_3_ = 0;
      result.m_backend.data._M_elems._32_5_ = 0;
      result.m_backend.data._M_elems[9]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&result_1,0.001);
      result.m_backend.data._M_elems[2] = result_10.m_backend.data._M_elems[2];
      result.m_backend.data._M_elems[3] = result_10.m_backend.data._M_elems[3];
      result.m_backend.data._M_elems[0] = result_10.m_backend.data._M_elems[0];
      result.m_backend.data._M_elems[1] = result_10.m_backend.data._M_elems[1];
      result.m_backend.data._M_elems[4] = result_10.m_backend.data._M_elems[4];
      result.m_backend.data._M_elems[5] = result_10.m_backend.data._M_elems[5];
      result.m_backend.data._M_elems._24_5_ = result_10.m_backend.data._M_elems._24_5_;
      result.m_backend.data._M_elems[7]._1_3_ = result_10.m_backend.data._M_elems[7]._1_3_;
      result.m_backend.data._M_elems._32_5_ = result_10.m_backend.data._M_elems._32_5_;
      result.m_backend.data._M_elems[9]._1_3_ = result_10.m_backend.data._M_elems[9]._1_3_;
      result.m_backend.exp = result_10.m_backend.exp;
      result.m_backend.neg = result_10.m_backend.neg;
      result.m_backend.fpclass = result_10.m_backend.fpclass;
      result.m_backend.prec_elem = result_10.m_backend.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&result.m_backend,&result_1.m_backend);
      auVar17 = (undefined1  [16])result.m_backend.data._M_elems._0_16_;
      local_5e8.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_5e8.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_5e8.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_5e8.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_5e8.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_5e8.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_5e8.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_5e8.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_5e8.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_5e8.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_5e8.exp = result.m_backend.exp;
      local_5e8.neg = result.m_backend.neg;
      local_5e8.fpclass = result.m_backend.fpclass;
      local_5e8.prec_elem = result.m_backend.prec_elem;
      local_79c = 0xffffffff;
      local_7a0 = 0xffffffff;
      result.m_backend.data._M_elems._0_16_ = auVar17;
      if (0 < (long)*(int *)(lVar6 + 0x58)) {
        uVar40 = (long)*(int *)(lVar6 + 0x58) + 1;
        local_7a0 = 0xffffffff;
        do {
          lVar35 = *(long *)(lVar6 + 0x70);
          uVar36 = *(uint *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4);
          lVar38 = (long)(int)uVar36 * 0x38;
          local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          uVar11 = *(undefined8 *)(lVar35 + lVar38);
          uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
          puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_798.data._M_elems[8] = (uint)uVar34;
          local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
          local_798.data._M_elems[4] = (uint)uVar13;
          local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
          local_798.data._M_elems[6] = (uint)uVar14;
          local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
          local_798.data._M_elems[0] = (uint)uVar11;
          local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
          local_798.data._M_elems[2] = (uint)uVar12;
          local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
          if (local_628.fpclass == cpp_dec_float_NaN || local_798.fpclass == cpp_dec_float_NaN) {
LAB_002d0c1b:
            result_1.m_backend.data._M_elems[2] = local_628.data._M_elems[2];
            result_1.m_backend.data._M_elems[3] = local_628.data._M_elems[3];
            result_1.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
            result_1.m_backend.data._M_elems[1] = local_628.data._M_elems[1];
            auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
            result_1.m_backend.data._M_elems._32_5_ = local_628.data._M_elems._32_5_;
            result_1.m_backend.data._M_elems[9]._1_3_ = local_628.data._M_elems[9]._1_3_;
            result_1.m_backend.data._M_elems[4] = local_628.data._M_elems[4];
            result_1.m_backend.data._M_elems[5] = local_628.data._M_elems[5];
            result_1.m_backend.data._M_elems._24_5_ = local_628.data._M_elems._24_5_;
            result_1.m_backend.data._M_elems[7]._1_3_ = local_628.data._M_elems[7]._1_3_;
            result_1.m_backend.exp = local_628.exp;
            result_1.m_backend.neg = local_628.neg;
            result_1.m_backend.prec_elem = local_628.prec_elem;
            result_1.m_backend.fpclass = local_628.fpclass;
            result_1.m_backend.data._M_elems[0] = local_628.data._M_elems[0];
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                local_628.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(local_628.neg ^ 1);
            }
            result_1.m_backend.data._M_elems._0_16_ = auVar17;
            if (((local_628.fpclass == cpp_dec_float_NaN) ||
                (local_798.fpclass == cpp_dec_float_NaN)) ||
               (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&result_1.m_backend), -1 < iVar26)) {
              lVar35 = *(long *)(lVar6 + 0x70);
              lVar38 = (long)*(int *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4) * 0x38;
              *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
              *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
              iVar26 = *(int *)(lVar6 + 0x58);
              *(int *)(lVar6 + 0x58) = iVar26 + -1;
              *(undefined4 *)(*(long *)(lVar6 + 0x60) + -8 + uVar40 * 4) =
                   *(undefined4 *)(*(long *)(lVar6 + 0x60) + -4 + (long)iVar26 * 4);
              uVar24 = result_1.m_backend._48_8_;
            }
            else {
              pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_638 + lVar38);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_1.m_backend,pcVar30);
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    result_1.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_1.m_backend != pcVar30) {
                  uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                  result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                  result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                  result_1.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                  result_1.m_backend.data._M_elems._16_8_ =
                       *(undefined8 *)((pcVar30->data)._M_elems + 4);
                  uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                  result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                  result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                  result_1.m_backend.exp = pcVar30->exp;
                  result_1.m_backend.neg = pcVar30->neg;
                  result_1.m_backend.fpclass = pcVar30->fpclass;
                  result_1.m_backend.prec_elem = pcVar30->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
              }
              local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
              local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
              local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_758.exp = result_1.m_backend.exp;
              local_758.neg = result_1.m_backend.neg;
              local_758.fpclass = result_1.m_backend.fpclass;
              local_758.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ = degeneps.m_backend.data._M_elems._24_5_;
              result_1.m_backend.data._M_elems[7]._1_3_ = degeneps.m_backend.data._M_elems[7]._1_3_;
              result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              uVar15._4_4_ = degeneps.m_backend.prec_elem;
              uVar15._0_4_ = degeneps.m_backend.fpclass;
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar27 = result_1.m_backend.fpclass;
              result_1.m_backend.data._M_elems._0_16_ = auVar17;
              result_1.m_backend._48_8_ = uVar15;
              if ((fVar27 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                 || (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_1.m_backend), -1 < iVar26)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar24 = result_1.m_backend._48_8_;
                if ((local_758.fpclass != cpp_dec_float_NaN) &&
                   ((local_5a8.fpclass != cpp_dec_float_NaN &&
                    (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&local_5a8), uVar24 = result_1.m_backend._48_8_,
                    -1 < iVar26)))) {
                  result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                  result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                  result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                  result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                  result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                  result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                  result_1.m_backend.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                  result_1.m_backend.data._M_elems[9]._1_3_ =
                       (undefined3)(local_798.data._M_elems[9] >> 8);
                  result_1.m_backend.data._M_elems._24_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
                  result_1.m_backend.data._M_elems[7]._1_3_ =
                       (undefined3)(local_798.data._M_elems[7] >> 8);
                  result_1.m_backend.exp = local_798.exp;
                  result_1.m_backend.neg = local_798.neg;
                  uVar24._0_4_ = local_798.fpclass;
                  uVar24._4_4_ = local_798.prec_elem;
                  result_1.m_backend.fpclass = local_798.fpclass;
                  result_1.m_backend.prec_elem = local_798.prec_elem;
                  if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite)
                  {
                    result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
                  }
                  if (((local_798.fpclass != cpp_dec_float_NaN) &&
                      (uVar24 = result_1.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN))
                     && (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&result_1.m_backend,&local_678),
                        uVar24 = result_1.m_backend._48_8_, 0 < iVar26)) {
                    iVar26 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    *)CONCAT44(extraout_var_28,iVar26),uVar36);
                    local_678.neg =
                         (bool)((local_798.data._M_elems[0] != 0 ||
                                local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                    uVar24 = result_1.m_backend._48_8_;
                    local_7a0 = uVar36;
                    local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                    local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                    local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                    local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                    local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                    local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                    local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                    local_718.exp = local_758.exp;
                    local_718.neg = local_758.neg;
                    local_718._48_8_ = local_758._48_8_;
                    local_678.data._M_elems[0] = local_798.data._M_elems[0];
                    local_678.data._M_elems[1] = local_798.data._M_elems[1];
                    local_678.data._M_elems[2] = local_798.data._M_elems[2];
                    local_678.data._M_elems[3] = local_798.data._M_elems[3];
                    local_678.data._M_elems[4] = local_798.data._M_elems[4];
                    local_678.data._M_elems[5] = local_798.data._M_elems[5];
                    local_678.data._M_elems[6] = local_798.data._M_elems[6];
                    local_678.data._M_elems[7] = local_798.data._M_elems[7];
                    local_678.data._M_elems[8] = local_798.data._M_elems[8];
                    local_678.data._M_elems[9] = local_798.data._M_elems[9];
                    local_678.exp = local_798.exp;
                    local_678._48_8_ = local_798._48_8_;
                  }
                }
              }
              else {
                iVar26 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar35 = *plVar5;
                local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
                local_1a8.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
                puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
                local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                local_1a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
                local_1a8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
                local_1a8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
                local_1a8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_29,iVar26),uVar36,&local_1a8);
                uVar24 = result_1.m_backend._48_8_;
              }
            }
          }
          else {
            iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_798,&local_628);
            if (iVar26 < 1) {
              goto LAB_002d0c1b;
            }
            pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_640 + lVar38);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_1.m_backend,pcVar30);
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  result_1.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_1.m_backend != pcVar30) {
                uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                result_1.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                result_1.m_backend.data._M_elems._16_8_ =
                     *(undefined8 *)((pcVar30->data)._M_elems + 4);
                uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                result_1.m_backend.exp = pcVar30->exp;
                result_1.m_backend.neg = pcVar30->neg;
                result_1.m_backend.fpclass = pcVar30->fpclass;
                result_1.m_backend.prec_elem = pcVar30->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
            }
            auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
            local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
            local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
            local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
            local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
            local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_758.exp = result_1.m_backend.exp;
            local_758.neg = result_1.m_backend.neg;
            local_758.fpclass = result_1.m_backend.fpclass;
            local_758.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.data._M_elems._0_16_ = auVar17;
            if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_758,&degeneps.m_backend), iVar26 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_758,&local_798);
              uVar24 = result_1.m_backend._48_8_;
              if (((local_758.fpclass != cpp_dec_float_NaN) &&
                  (local_5a8.fpclass != cpp_dec_float_NaN)) &&
                 ((iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_758,&local_5a8), uVar24 = result_1.m_backend._48_8_,
                  -1 < iVar26 &&
                  (((local_798.fpclass != cpp_dec_float_NaN &&
                    (local_678.fpclass != cpp_dec_float_NaN)) &&
                   (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&local_678), uVar24 = result_1.m_backend._48_8_,
                   0 < iVar26)))))) {
                iVar26 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_27,iVar26),uVar36);
                local_678.neg = local_798.neg;
                uVar24 = result_1.m_backend._48_8_;
                local_7a0 = uVar36;
                local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
                local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
                local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
                local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
                local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
                local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
                local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
                local_718.exp = local_758.exp;
                local_718.neg = local_758.neg;
                local_718._48_8_ = local_758._48_8_;
                local_678.data._M_elems[0] = local_798.data._M_elems[0];
                local_678.data._M_elems[1] = local_798.data._M_elems[1];
                local_678.data._M_elems[2] = local_798.data._M_elems[2];
                local_678.data._M_elems[3] = local_798.data._M_elems[3];
                local_678.data._M_elems[4] = local_798.data._M_elems[4];
                local_678.data._M_elems[5] = local_798.data._M_elems[5];
                local_678.data._M_elems[6] = local_798.data._M_elems[6];
                local_678.data._M_elems[7] = local_798.data._M_elems[7];
                local_678.data._M_elems[8] = local_798.data._M_elems[8];
                local_678.data._M_elems[9] = local_798.data._M_elems[9];
                local_678.exp = local_798.exp;
                local_678._48_8_ = local_798._48_8_;
              }
            }
            else {
              iVar26 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar35 = *plVar5;
              local_168.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
              local_168.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
              puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
              local_168.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_168.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_168.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_168.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_168.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_168.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_26,iVar26),uVar36,&local_168);
              uVar24 = result_1.m_backend._48_8_;
            }
          }
          result_1.m_backend._48_8_ = uVar24;
          uVar40 = uVar40 - 1;
        } while (1 < uVar40);
      }
      if (0 < (long)*(int *)(lVar8 + 0x58)) {
        local_79c = 0xffffffff;
        uVar40 = (long)*(int *)(lVar8 + 0x58);
        do {
          lVar35 = *(long *)(lVar8 + 0x70);
          iVar26 = *(int *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4);
          lVar38 = (long)iVar26 * 0x38;
          local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          uVar11 = *(undefined8 *)(lVar35 + lVar38);
          uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
          puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
          uVar13 = *puVar1;
          uVar14 = puVar1[1];
          uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_798.data._M_elems[8] = (uint)uVar34;
          local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
          local_798.data._M_elems[4] = (uint)uVar13;
          local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
          local_798.data._M_elems[6] = (uint)uVar14;
          local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
          local_798.data._M_elems[0] = (uint)uVar11;
          local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
          local_798.data._M_elems[2] = (uint)uVar12;
          local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
          if (local_5e8.fpclass == cpp_dec_float_NaN || local_798.fpclass == cpp_dec_float_NaN) {
LAB_002d140c:
            result_1.m_backend.data._M_elems[2] = local_5e8.data._M_elems[2];
            result_1.m_backend.data._M_elems[3] = local_5e8.data._M_elems[3];
            result_1.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
            result_1.m_backend.data._M_elems[1] = local_5e8.data._M_elems[1];
            auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
            result_1.m_backend.data._M_elems._32_5_ = local_5e8.data._M_elems._32_5_;
            result_1.m_backend.data._M_elems[9]._1_3_ = local_5e8.data._M_elems[9]._1_3_;
            result_1.m_backend.data._M_elems[4] = local_5e8.data._M_elems[4];
            result_1.m_backend.data._M_elems[5] = local_5e8.data._M_elems[5];
            result_1.m_backend.data._M_elems._24_5_ = local_5e8.data._M_elems._24_5_;
            result_1.m_backend.data._M_elems[7]._1_3_ = local_5e8.data._M_elems[7]._1_3_;
            result_1.m_backend.exp = local_5e8.exp;
            result_1.m_backend.neg = local_5e8.neg;
            result_1.m_backend.prec_elem = local_5e8.prec_elem;
            result_1.m_backend.fpclass = local_5e8.fpclass;
            result_1.m_backend.data._M_elems[0] = local_5e8.data._M_elems[0];
            if (result_1.m_backend.data._M_elems[0] != 0 ||
                local_5e8.fpclass != cpp_dec_float_finite) {
              result_1.m_backend.neg = (bool)(local_5e8.neg ^ 1);
            }
            result_1.m_backend.data._M_elems._0_16_ = auVar17;
            if (((local_5e8.fpclass == cpp_dec_float_NaN) ||
                (local_798.fpclass == cpp_dec_float_NaN)) ||
               (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_798,&result_1.m_backend), -1 < iVar28)) {
              lVar35 = *(long *)(lVar8 + 0x70);
              lVar38 = (long)*(int *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4) * 0x38;
              *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
              *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
              *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
              iVar26 = *(int *)(lVar8 + 0x58);
              *(int *)(lVar8 + 0x58) = iVar26 + -1;
              *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + uVar40 * 4) =
                   *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + (long)iVar26 * 4);
              uVar23 = result_1.m_backend._48_8_;
            }
            else {
              pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*plVar9 + lVar38);
              result_1.m_backend.fpclass = cpp_dec_float_finite;
              result_1.m_backend.prec_elem = 10;
              result_1.m_backend.data._M_elems[0] = 0;
              result_1.m_backend.data._M_elems[1] = 0;
              result_1.m_backend.data._M_elems[2] = 0;
              result_1.m_backend.data._M_elems[3] = 0;
              result_1.m_backend.data._M_elems[4] = 0;
              result_1.m_backend.data._M_elems[5] = 0;
              result_1.m_backend.data._M_elems._24_5_ = 0;
              result_1.m_backend.data._M_elems[7]._1_3_ = 0;
              result_1.m_backend.data._M_elems._32_5_ = 0;
              result_1.m_backend.data._M_elems[9]._1_3_ = 0;
              result_1.m_backend.exp = 0;
              result_1.m_backend.neg = false;
              if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_1.m_backend,pcVar30);
                if (result_1.m_backend.data._M_elems[0] != 0 ||
                    result_1.m_backend.fpclass != cpp_dec_float_finite) {
                  result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
                }
              }
              else {
                if (&result_1.m_backend != pcVar30) {
                  uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                  result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                  result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                  result_1.m_backend.data._M_elems._0_16_ =
                       *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                  result_1.m_backend.data._M_elems._16_8_ =
                       *(undefined8 *)((pcVar30->data)._M_elems + 4);
                  uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                  result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                  result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                  result_1.m_backend.exp = pcVar30->exp;
                  result_1.m_backend.neg = pcVar30->neg;
                  result_1.m_backend.fpclass = pcVar30->fpclass;
                  result_1.m_backend.prec_elem = pcVar30->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38));
              }
              local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
              local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
              local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
              local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
              local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
              local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
              local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
              local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
              local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
              local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
              local_758.exp = result_1.m_backend.exp;
              local_758.neg = result_1.m_backend.neg;
              local_758.fpclass = result_1.m_backend.fpclass;
              local_758.prec_elem = result_1.m_backend.prec_elem;
              result_1.m_backend.data._M_elems._32_5_ = degeneps.m_backend.data._M_elems._32_5_;
              result_1.m_backend.data._M_elems[9]._1_3_ = degeneps.m_backend.data._M_elems[9]._1_3_;
              result_1.m_backend.data._M_elems[4] = degeneps.m_backend.data._M_elems[4];
              result_1.m_backend.data._M_elems[5] = degeneps.m_backend.data._M_elems[5];
              result_1.m_backend.data._M_elems._24_5_ = degeneps.m_backend.data._M_elems._24_5_;
              result_1.m_backend.data._M_elems[7]._1_3_ = degeneps.m_backend.data._M_elems[7]._1_3_;
              result_1.m_backend.data._M_elems[2] = degeneps.m_backend.data._M_elems[2];
              result_1.m_backend.data._M_elems[3] = degeneps.m_backend.data._M_elems[3];
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              result_1.m_backend.data._M_elems[1] = degeneps.m_backend.data._M_elems[1];
              auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
              result_1.m_backend.exp = degeneps.m_backend.exp;
              result_1.m_backend.neg = degeneps.m_backend.neg;
              uVar16._4_4_ = degeneps.m_backend.prec_elem;
              uVar16._0_4_ = degeneps.m_backend.fpclass;
              result_1.m_backend.data._M_elems[0] = degeneps.m_backend.data._M_elems[0];
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  degeneps.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(degeneps.m_backend.neg ^ 1);
              }
              fVar27 = result_1.m_backend.fpclass;
              result_1.m_backend.data._M_elems._0_16_ = auVar17;
              result_1.m_backend._48_8_ = uVar16;
              if ((fVar27 == cpp_dec_float_NaN || degeneps.m_backend.fpclass == cpp_dec_float_NaN)
                 || (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&result_1.m_backend), -1 < iVar28)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                          (&local_758,&local_798);
                uVar23 = result_1.m_backend._48_8_;
                if ((local_758.fpclass != cpp_dec_float_NaN) &&
                   ((local_5a8.fpclass != cpp_dec_float_NaN &&
                    (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare(&local_758,&local_5a8), uVar23 = result_1.m_backend._48_8_,
                    -1 < iVar28)))) {
                  result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
                  result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
                  result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
                  result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
                  result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
                  result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
                  result_1.m_backend.data._M_elems._32_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
                  result_1.m_backend.data._M_elems[9]._1_3_ =
                       (undefined3)(local_798.data._M_elems[9] >> 8);
                  result_1.m_backend.data._M_elems._24_5_ =
                       SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
                  result_1.m_backend.data._M_elems[7]._1_3_ =
                       (undefined3)(local_798.data._M_elems[7] >> 8);
                  result_1.m_backend.exp = local_798.exp;
                  result_1.m_backend.neg = local_798.neg;
                  uVar23._0_4_ = local_798.fpclass;
                  uVar23._4_4_ = local_798.prec_elem;
                  result_1.m_backend.fpclass = local_798.fpclass;
                  result_1.m_backend.prec_elem = local_798.prec_elem;
                  if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite)
                  {
                    result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
                  }
                  if (((local_798.fpclass != cpp_dec_float_NaN) &&
                      (uVar23 = result_1.m_backend._48_8_, local_678.fpclass != cpp_dec_float_NaN))
                     && (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                  compare(&result_1.m_backend,&local_678),
                        uVar23 = result_1.m_backend._48_8_, 0 < iVar28)) {
                    iVar28 = (*(this->
                               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               )._vptr_SPxRatioTester[3])();
                    enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)CONCAT44(extraout_var_32,iVar28),iVar26);
                    local_678.neg =
                         (bool)((local_798.data._M_elems[0] != 0 ||
                                local_798.fpclass != cpp_dec_float_finite) ^ local_798.neg);
                    goto LAB_002d1a70;
                  }
                }
              }
              else {
                iVar28 = (*(this->
                           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           )._vptr_SPxRatioTester[3])();
                lVar35 = *plVar7;
                local_228.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
                local_228.m_backend.data._M_elems._8_8_ =
                     *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
                puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
                local_228.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                local_228.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
                local_228.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
                local_228.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
                local_228.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
                local_228.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
                SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::shiftUCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_33,iVar28),iVar26,&local_228);
                uVar23 = result_1.m_backend._48_8_;
              }
            }
          }
          else {
            iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&local_798,&local_5e8);
            if (iVar28 < 1) {
              goto LAB_002d140c;
            }
            pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*plVar10 + lVar38);
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 10;
            result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems._24_5_ = 0;
            result_1.m_backend.data._M_elems[7]._1_3_ = 0;
            result_1.m_backend.data._M_elems._32_5_ = 0;
            result_1.m_backend.data._M_elems[9]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_1.m_backend,pcVar30);
              if (result_1.m_backend.data._M_elems[0] != 0 ||
                  result_1.m_backend.fpclass != cpp_dec_float_finite) {
                result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
              }
            }
            else {
              if (&result_1.m_backend != pcVar30) {
                uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
                result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
                result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                result_1.m_backend.data._M_elems._0_16_ =
                     *(undefined1 (*) [16])(pcVar30->data)._M_elems;
                result_1.m_backend.data._M_elems._16_8_ =
                     *(undefined8 *)((pcVar30->data)._M_elems + 4);
                uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
                result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
                result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
                result_1.m_backend.exp = pcVar30->exp;
                result_1.m_backend.neg = pcVar30->neg;
                result_1.m_backend.fpclass = pcVar30->fpclass;
                result_1.m_backend.prec_elem = pcVar30->prec_elem;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar7 + lVar38));
            }
            auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
            local_758.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
            local_758.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
            local_758.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
            local_758.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
            local_758.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
            local_758.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
            local_758.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
            local_758.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
            local_758.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
            local_758.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
            local_758.exp = result_1.m_backend.exp;
            local_758.neg = result_1.m_backend.neg;
            local_758.fpclass = result_1.m_backend.fpclass;
            local_758.prec_elem = result_1.m_backend.prec_elem;
            result_1.m_backend.data._M_elems._0_16_ = auVar17;
            if (((result_1.m_backend.fpclass == cpp_dec_float_NaN) ||
                (degeneps.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&local_758,&degeneps.m_backend), iVar28 < 1)) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
                        (&local_758,&local_798);
              uVar23 = result_1.m_backend._48_8_;
              if (((local_758.fpclass == cpp_dec_float_NaN) ||
                  (local_5a8.fpclass == cpp_dec_float_NaN)) ||
                 ((iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (&local_758,&local_5a8), uVar23 = result_1.m_backend._48_8_,
                  iVar28 < 0 ||
                  (((local_798.fpclass == cpp_dec_float_NaN ||
                    (local_678.fpclass == cpp_dec_float_NaN)) ||
                   (iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&local_798,&local_678), uVar23 = result_1.m_backend._48_8_,
                   iVar28 < 1)))))) goto LAB_002d14d7;
              iVar28 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              enterId = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)CONCAT44(extraout_var_31,iVar28),iVar26);
              local_678.neg = local_798.neg;
LAB_002d1a70:
              local_79c = (uint)(uVar40 - 1);
              uVar23 = result_1.m_backend._48_8_;
              local_718.data._M_elems._0_8_ = local_758.data._M_elems._0_8_;
              local_718.data._M_elems._8_8_ = local_758.data._M_elems._8_8_;
              local_718.data._M_elems._16_8_ = local_758.data._M_elems._16_8_;
              local_718.data._M_elems._24_5_ = local_758.data._M_elems._24_5_;
              local_718.data._M_elems[7]._1_3_ = local_758.data._M_elems[7]._1_3_;
              local_718.data._M_elems._32_5_ = local_758.data._M_elems._32_5_;
              local_718.data._M_elems[9]._1_3_ = local_758.data._M_elems[9]._1_3_;
              local_718.exp = local_758.exp;
              local_718.neg = local_758.neg;
              local_718._48_8_ = local_758._48_8_;
              local_678.data._M_elems[0] = local_798.data._M_elems[0];
              local_678.data._M_elems[1] = local_798.data._M_elems[1];
              local_678.data._M_elems[2] = local_798.data._M_elems[2];
              local_678.data._M_elems[3] = local_798.data._M_elems[3];
              local_678.data._M_elems[4] = local_798.data._M_elems[4];
              local_678.data._M_elems[5] = local_798.data._M_elems[5];
              local_678.data._M_elems[6] = local_798.data._M_elems[6];
              local_678.data._M_elems[7] = local_798.data._M_elems[7];
              local_678.data._M_elems[8] = local_798.data._M_elems[8];
              local_678.data._M_elems[9] = local_798.data._M_elems[9];
              local_678.exp = local_798.exp;
              local_678._48_8_ = local_798._48_8_;
            }
            else {
              iVar28 = (*(this->
                         super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._vptr_SPxRatioTester[3])();
              lVar35 = *plVar7;
              local_1e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
              local_1e8.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
              puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
              local_1e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_1e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_1e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
              local_1e8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
              local_1e8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
              local_1e8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
              SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::shiftLCbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(extraout_var_30,iVar28),iVar26,&local_1e8);
              uVar23 = result_1.m_backend._48_8_;
            }
          }
LAB_002d14d7:
          result_1.m_backend._48_8_ = uVar23;
          bVar25 = 1 < uVar40;
          uVar40 = uVar40 - 1;
        } while (bVar25);
      }
      iVar26 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      (**(code **)(*(long *)CONCAT44(extraout_var_34,iVar26) + 0x368))
                (&result_1,(long *)CONCAT44(extraout_var_34,iVar26));
    } while (((local_4a8.fpclass == cpp_dec_float_NaN) ||
             (result_1.m_backend.fpclass == cpp_dec_float_NaN)) ||
            (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&local_4a8,&result_1.m_backend), iVar26 != 0));
    if (-1 < (int)local_79c) {
      iVar26 = (*(this->
                 super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._vptr_SPxRatioTester[3])();
      bVar25 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_35,iVar26),&enterId);
      if (!bVar25) goto LAB_002d0546;
      lVar35 = *(long *)(lVar8 + 0x70);
      lVar38 = (long)*(int *)(*(long *)(lVar8 + 0x60) + (ulong)local_79c * 4) * 0x38;
      *(undefined8 *)(lVar35 + 0x30 + lVar38) = 0xa00000000;
      *(undefined1 (*) [16])(lVar35 + lVar38) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar35 + 0x10 + lVar38) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(lVar35 + 0x1d + lVar38) = (undefined1  [16])0x0;
      iVar26 = *(int *)(lVar8 + 0x58);
      *(int *)(lVar8 + 0x58) = iVar26 + -1;
      *(undefined4 *)(*(long *)(lVar8 + 0x60) + (ulong)local_79c * 4) =
           *(undefined4 *)(*(long *)(lVar8 + 0x60) + -4 + (long)iVar26 * 4);
      goto LAB_002d05df;
    }
    if ((int)local_7a0 < 0) {
LAB_002d2319:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&val->m_backend,0);
      enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
      uVar33._0_4_ = enterId.super_DataKey.info;
      uVar33._4_4_ = enterId.super_DataKey.idx;
      return (SPxId)uVar33;
    }
    iVar26 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    lVar35 = *(long *)(CONCAT44(extraout_var_36,iVar26) + 0x790);
    lVar38 = *(long *)(lVar35 + 0x20);
    lVar35 = (long)*(int *)(*(long *)(lVar35 + 0x28) + 4 + (ulong)local_7a0 * 8);
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 10;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems._24_5_ = 0;
    result_1.m_backend.data._M_elems[7]._1_3_ = 0;
    result_1.m_backend.data._M_elems._32_5_ = 0;
    result_1.m_backend.data._M_elems[9]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    iVar26 = *(int *)(lVar38 + 0xc + lVar35 * 0x28);
    if (0 < iVar26) {
      pcVar30 = *(cpp_dec_float<50U,_int,_void> **)(lVar38 + lVar35 * 0x28);
      uVar36 = iVar26 + 1;
      do {
        pcVar31 = (cpp_dec_float<50U,_int,_void> *)
                  ((long)(int)pcVar30[1].data._M_elems[0] * 0x38 + *plVar7);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        pcVar37 = pcVar30;
        if ((&result.m_backend != pcVar31) && (pcVar37 = pcVar31, pcVar30 != &result.m_backend)) {
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
          result.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
          result.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar30->data)._M_elems;
          result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar30->data)._M_elems + 4);
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
          result.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
          result.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result.m_backend.exp = pcVar30->exp;
          result.m_backend.neg = pcVar30->neg;
          result.m_backend.fpclass = pcVar30->fpclass;
          result.m_backend.prec_elem = pcVar30->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,pcVar37);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&result_1.m_backend,&result.m_backend);
        pcVar30 = (cpp_dec_float<50U,_int,_void> *)(pcVar30[1].data._M_elems + 1);
        uVar36 = uVar36 - 1;
      } while (1 < uVar36);
    }
    result.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    result.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    uVar36 = result_1.m_backend.data._M_elems[0];
    uVar18 = result_1.m_backend.data._M_elems[1];
    uVar19 = result_1.m_backend.data._M_elems[2];
    uVar20 = result_1.m_backend.data._M_elems[3];
    result.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    result.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    result.m_backend.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
    result.m_backend.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
    result.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    result.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    result.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    result.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    lVar35 = *plVar5;
    lVar38 = (ulong)local_7a0 * 0x38;
    *(ulong *)(lVar35 + 0x20 + lVar38) =
         CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,result_1.m_backend.data._M_elems._32_5_)
    ;
    puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
    *(undefined8 *)puVar2 = result_1.m_backend.data._M_elems._16_8_;
    *(ulong *)(puVar2 + 2) =
         CONCAT35(result_1.m_backend.data._M_elems[7]._1_3_,result_1.m_backend.data._M_elems._24_5_)
    ;
    puVar2 = (uint *)(lVar35 + lVar38);
    *puVar2 = uVar36;
    puVar2[1] = uVar18;
    puVar2[2] = uVar19;
    puVar2[3] = uVar20;
    *(int *)(lVar35 + 0x28 + lVar38) = result_1.m_backend.exp;
    *(bool *)(lVar35 + 0x2c + lVar38) = result_1.m_backend.neg;
    *(undefined8 *)(lVar35 + 0x30 + lVar38) = result_1.m_backend._48_8_;
    iVar26 = (*(this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._vptr_SPxRatioTester[3])();
    bVar25 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_37,iVar26),&enterId);
    if (bVar25) {
      local_78 = 0xa00000000;
      local_a8[0] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[1] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[2] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[3] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[4] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[5] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[6] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[7] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[8] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[9] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[10] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xb] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xc] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xd] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xe] = (cpp_dec_float<50u,int,void>)0x0;
      local_a8[0xf] = (cpp_dec_float<50u,int,void>)0x0;
      local_98 = SUB1613((undefined1  [16])0x0,0);
      uStack_8b = 0;
      auStack_88 = SUB1613((undefined1  [16])0x0,3);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(local_a8,0.0);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::setValue((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)(lVar6 + 0x50),local_7a0,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_a8);
      goto LAB_002d05df;
    }
    lVar35 = *(long *)(lVar6 + 0x70);
    local_798.exp = *(int *)(lVar35 + 0x28 + lVar38);
    local_798.neg = *(bool *)(lVar35 + 0x2c + lVar38);
    local_798._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
    uVar11 = *(undefined8 *)(lVar35 + lVar38);
    uVar12 = ((undefined8 *)(lVar35 + lVar38))[1];
    puVar1 = (undefined8 *)(lVar35 + 0x10 + lVar38);
    uVar13 = *puVar1;
    uVar14 = puVar1[1];
    uVar34 = *(undefined8 *)(lVar35 + 0x20 + lVar38);
    local_798.data._M_elems[8] = (uint)uVar34;
    local_798.data._M_elems[9] = (uint)((ulong)uVar34 >> 0x20);
    local_798.data._M_elems[4] = (uint)uVar13;
    local_798.data._M_elems[5] = (uint)((ulong)uVar13 >> 0x20);
    local_798.data._M_elems[6] = (uint)uVar14;
    local_798.data._M_elems[7] = (uint)((ulong)uVar14 >> 0x20);
    local_798.data._M_elems[0] = (uint)uVar11;
    local_798.data._M_elems[1] = (uint)((ulong)uVar11 >> 0x20);
    local_798.data._M_elems[2] = (uint)uVar12;
    local_798.data._M_elems[3] = (uint)((ulong)uVar12 >> 0x20);
    if (local_798.fpclass == cpp_dec_float_NaN) {
LAB_002d1ef8:
      pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_638 + lVar38);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_1.m_backend,pcVar30);
        if (result_1.m_backend.data._M_elems[0] != 0 ||
            result_1.m_backend.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_1.m_backend != pcVar30) {
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
          result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
          result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result_1.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar30->data)._M_elems;
          result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar30->data)._M_elems + 4);
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
          result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
          result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result_1.m_backend.exp = pcVar30->exp;
          result_1.m_backend.neg = pcVar30->neg;
          result_1.m_backend.fpclass = pcVar30->fpclass;
          result_1.m_backend.prec_elem = pcVar30->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
      }
      local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
      local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
      local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_718.exp = result_1.m_backend.exp;
      local_718.neg = result_1.m_backend.neg;
      local_718.fpclass = result_1.m_backend.fpclass;
      local_718.prec_elem = result_1.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._32_5_ =
           SUB85(CONCAT44(local_798.data._M_elems[9],local_798.data._M_elems[8]),0);
      result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)(local_798.data._M_elems[9] >> 8);
      result_1.m_backend.data._M_elems[1] = local_798.data._M_elems[1];
      result_1.m_backend.data._M_elems[0] = local_798.data._M_elems[0];
      result_1.m_backend.data._M_elems[3] = local_798.data._M_elems[3];
      result_1.m_backend.data._M_elems[2] = local_798.data._M_elems[2];
      result_1.m_backend.data._M_elems[5] = local_798.data._M_elems[5];
      result_1.m_backend.data._M_elems[4] = local_798.data._M_elems[4];
      result_1.m_backend.data._M_elems._24_5_ =
           SUB85(CONCAT44(local_798.data._M_elems[7],local_798.data._M_elems[6]),0);
      result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)(local_798.data._M_elems[7] >> 8);
      result_1.m_backend.exp = local_798.exp;
      result_1.m_backend.neg = local_798.neg;
      result_1.m_backend.fpclass = local_798.fpclass;
      result_1.m_backend.prec_elem = local_798.prec_elem;
      if (local_798.data._M_elems[0] != 0 || local_798.fpclass != cpp_dec_float_finite) {
        result_1.m_backend.neg = (bool)(local_798.neg ^ 1);
      }
      uVar21 = result_1.m_backend.data._M_elems._16_8_;
      uVar22 = result_1.m_backend._48_8_;
      if (((((local_798.fpclass != cpp_dec_float_NaN) &&
            (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,&minStability.m_backend),
           uVar21 = result_1.m_backend.data._M_elems._16_8_, uVar22 = result_1.m_backend._48_8_,
           iVar26 < 0)) &&
          ((local_718.fpclass != cpp_dec_float_NaN &&
           ((this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)))) &&
         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_718,local_630),
         uVar21 = result_1.m_backend.data._M_elems._16_8_, uVar22 = result_1.m_backend._48_8_,
         iVar26 < 0)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::div_unsigned_long_long
                  (&minStability.m_backend,2);
        iVar26 = (*(this->
                   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._vptr_SPxRatioTester[3])();
        lVar35 = *plVar5;
        local_2a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
        local_2a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
        puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
        local_2a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_2a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        local_2a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
        local_2a8.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
        local_2a8.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
        local_2a8.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
        SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::shiftUPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(extraout_var_38,iVar26),local_7a0,&local_2a8);
        goto LAB_002d05df;
      }
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&result_1.m_backend,0,(type *)0x0);
      iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_798,&result_1.m_backend);
      if (iVar26 < 1) goto LAB_002d1ef8;
      pcVar30 = (cpp_dec_float<50U,_int,_void> *)(*local_640 + lVar38);
      result_1.m_backend.fpclass = cpp_dec_float_finite;
      result_1.m_backend.prec_elem = 10;
      result_1.m_backend.data._M_elems._0_16_ = ZEXT816(0);
      result_1.m_backend.data._M_elems[4] = 0;
      result_1.m_backend.data._M_elems[5] = 0;
      result_1.m_backend.data._M_elems._24_5_ = 0;
      result_1.m_backend.data._M_elems[7]._1_3_ = 0;
      result_1.m_backend.data._M_elems._32_5_ = 0;
      result_1.m_backend.data._M_elems[9]._1_3_ = 0;
      result_1.m_backend.exp = 0;
      result_1.m_backend.neg = false;
      if (&result_1.m_backend == (cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38)) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_1.m_backend,pcVar30);
        if (result_1.m_backend.data._M_elems[0] != 0 ||
            result_1.m_backend.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
        }
      }
      else {
        if (&result_1.m_backend != pcVar30) {
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 8);
          result_1.m_backend.data._M_elems._32_5_ = SUB85(uVar34,0);
          result_1.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result_1.m_backend.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar30->data)._M_elems;
          result_1.m_backend.data._M_elems._16_8_ = *(undefined8 *)((pcVar30->data)._M_elems + 4);
          uVar34 = *(undefined8 *)((pcVar30->data)._M_elems + 6);
          result_1.m_backend.data._M_elems._24_5_ = SUB85(uVar34,0);
          result_1.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar34 >> 0x28);
          result_1.m_backend.exp = pcVar30->exp;
          result_1.m_backend.neg = pcVar30->neg;
          result_1.m_backend.fpclass = pcVar30->fpclass;
          result_1.m_backend.prec_elem = pcVar30->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&result_1.m_backend,(cpp_dec_float<50U,_int,_void> *)(*plVar5 + lVar38));
      }
      auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
      local_718.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
      local_718.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
      local_718.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
      local_718.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
      local_718.data._M_elems._24_5_ = result_1.m_backend.data._M_elems._24_5_;
      local_718.data._M_elems[7]._1_3_ = result_1.m_backend.data._M_elems[7]._1_3_;
      local_718.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
      local_718.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
      local_718.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
      local_718.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
      local_718.exp = result_1.m_backend.exp;
      local_718.neg = result_1.m_backend.neg;
      local_718.fpclass = result_1.m_backend.fpclass;
      local_718.prec_elem = result_1.m_backend.prec_elem;
      result_1.m_backend.data._M_elems._0_16_ = auVar17;
      uVar21 = result_1.m_backend.data._M_elems._16_8_;
      uVar22 = result_1.m_backend._48_8_;
      if (((local_798.fpclass != cpp_dec_float_NaN) &&
          (minStability.m_backend.fpclass != cpp_dec_float_NaN)) &&
         (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_798,&minStability.m_backend),
         uVar21 = result_1.m_backend.data._M_elems._16_8_, uVar22 = result_1.m_backend._48_8_,
         iVar26 < 0)) {
        uVar21._0_4_ = local_718.data._M_elems[4];
        uVar21._4_4_ = local_718.data._M_elems[5];
        result_1.m_backend.data._M_elems[2] = local_718.data._M_elems[2];
        result_1.m_backend.data._M_elems[3] = local_718.data._M_elems[3];
        result_1.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
        result_1.m_backend.data._M_elems[1] = local_718.data._M_elems[1];
        auVar17 = (undefined1  [16])result_1.m_backend.data._M_elems._0_16_;
        result_1.m_backend.data._M_elems._32_5_ = local_718.data._M_elems._32_5_;
        result_1.m_backend.data._M_elems[9]._1_3_ = local_718.data._M_elems[9]._1_3_;
        result_1.m_backend.data._M_elems[4] = local_718.data._M_elems[4];
        result_1.m_backend.data._M_elems[5] = local_718.data._M_elems[5];
        result_1.m_backend.data._M_elems._24_5_ = local_718.data._M_elems._24_5_;
        result_1.m_backend.data._M_elems[7]._1_3_ = local_718.data._M_elems[7]._1_3_;
        result_1.m_backend.exp = local_718.exp;
        result_1.m_backend.neg = local_718.neg;
        uVar22._0_4_ = local_718.fpclass;
        uVar22._4_4_ = local_718.prec_elem;
        result_1.m_backend.fpclass = local_718.fpclass;
        result_1.m_backend.prec_elem = local_718.prec_elem;
        result_1.m_backend.data._M_elems[0] = local_718.data._M_elems[0];
        if (result_1.m_backend.data._M_elems[0] != 0 || local_718.fpclass != cpp_dec_float_finite) {
          result_1.m_backend.neg = (bool)(local_718.neg ^ 1);
        }
        result_1.m_backend.data._M_elems._0_16_ = auVar17;
        if (((local_718.fpclass != cpp_dec_float_NaN) &&
            (uVar21 = result_1.m_backend.data._M_elems._16_8_, uVar22 = result_1.m_backend._48_8_,
            (this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).delta.m_backend.fpclass != cpp_dec_float_NaN)) &&
           (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&result_1.m_backend,local_630),
           uVar21 = result_1.m_backend.data._M_elems._16_8_, uVar22 = result_1.m_backend._48_8_,
           iVar26 < 0)) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::div_unsigned_long_long
                    (&minStability.m_backend,2);
          iVar26 = (*(this->
                     super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._vptr_SPxRatioTester[3])();
          lVar35 = *plVar5;
          local_268.m_backend.data._M_elems._0_8_ = *(undefined8 *)(lVar35 + lVar38);
          local_268.m_backend.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar35 + lVar38) + 2);
          puVar2 = (uint *)(lVar35 + 0x10 + lVar38);
          local_268.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_268.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_268.m_backend.data._M_elems._32_8_ = *(undefined8 *)(lVar35 + 0x20 + lVar38);
          local_268.m_backend.exp = *(int *)(lVar35 + 0x28 + lVar38);
          local_268.m_backend.neg = *(bool *)(lVar35 + 0x2c + lVar38);
          local_268.m_backend._48_8_ = *(undefined8 *)(lVar35 + 0x30 + lVar38);
          SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::shiftLPbound((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(extraout_var_39,iVar26),local_7a0,&local_268);
          goto LAB_002d05df;
        }
      }
    }
    result_1.m_backend._48_8_ = uVar22;
    result_1.m_backend.data._M_elems._16_8_ = uVar21;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator/=
              (&local_718,&local_798);
    if (((local_718.fpclass == cpp_dec_float_NaN) || (local_5a8.fpclass == cpp_dec_float_NaN)) ||
       (iVar26 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_718,&local_5a8), -1 < iVar26)) goto LAB_002d0546;
  } while( true );
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}